

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::avx512::CurveNiMBIntersector1<4>::
     intersect_n<embree::avx512::OrientedCurve1Intersector1<embree::BSplineCurveT,7,8>,embree::avx512::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  ulong uVar2;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  uint uVar6;
  uint uVar7;
  Geometry *pGVar8;
  __int_type_conflict _Var9;
  long lVar10;
  long lVar11;
  long lVar12;
  RTCFilterFunctionN p_Var13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  byte bVar23;
  uint uVar24;
  ulong uVar25;
  long lVar27;
  uint uVar28;
  long lVar29;
  ulong uVar30;
  long lVar31;
  ulong uVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 in_YmmResult [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar87 [32];
  undefined1 auVar89 [32];
  undefined1 auVar91 [32];
  undefined1 auVar93 [32];
  undefined1 auVar95 [32];
  int iVar97;
  undefined4 uVar98;
  vint4 bi_2;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  vint4 bi_1;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  vint4 bi;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [32];
  vfloat4 a0;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [32];
  vfloat4 b0;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  vint4 ai;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  vint4 ai_1;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [32];
  float fVar159;
  float fVar168;
  vint4 ai_2;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  float fVar177;
  float fVar191;
  float fVar192;
  float fVar193;
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [32];
  vfloat4 a0_4;
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  float fVar202;
  float fVar213;
  float fVar214;
  vfloat4 b0_1;
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  float fVar215;
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  float fVar216;
  float fVar217;
  float fVar218;
  __m128 a_3;
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  vfloat4 a0_5;
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [64];
  undefined1 auVar246 [64];
  undefined1 auVar247 [64];
  undefined1 auVar248 [64];
  undefined1 auVar249 [64];
  undefined1 auVar250 [64];
  undefined1 auVar251 [64];
  undefined1 in_ZMM31 [64];
  undefined1 auVar252 [64];
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  vfloat_impl<4> p02;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  int local_31c;
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  ulong local_2f0;
  undefined1 local_2e8 [8];
  float fStack_2e0;
  float fStack_2dc;
  undefined1 local_2d8 [8];
  float fStack_2d0;
  float fStack_2cc;
  undefined1 local_2c8 [8];
  float fStack_2c0;
  float fStack_2bc;
  undefined1 local_2b8 [8];
  float fStack_2b0;
  float fStack_2ac;
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  long local_258;
  Primitive *local_250;
  RTCFilterFunctionNArguments local_248;
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [8];
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1f8 [8];
  float fStack_1f0;
  float fStack_1ec;
  undefined1 local_1e8 [8];
  float fStack_1e0;
  float fStack_1dc;
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  uint auStack_198 [4];
  undefined8 local_188;
  float local_180;
  undefined8 local_17c;
  uint local_174;
  uint local_170;
  uint local_16c;
  uint local_168;
  undefined1 local_158 [16];
  undefined1 local_148 [8];
  float fStack_140;
  float fStack_13c;
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [8];
  float fStack_f0;
  float fStack_ec;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined8 uStack_b8;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 uStack_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar26;
  undefined1 auVar86 [32];
  undefined1 auVar88 [32];
  undefined1 auVar90 [32];
  undefined1 auVar92 [32];
  undefined1 auVar94 [32];
  undefined1 auVar96 [32];
  undefined1 auVar237 [32];
  
  uVar25 = (ulong)(byte)prim[1];
  auVar47 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar25 * 4 + 6)));
  auVar44 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar25 * 5 + 6)));
  auVar45 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar25 * 6 + 6)));
  auVar46 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar25 * 0xf + 6)));
  lVar31 = uVar25 * 0x25;
  auVar48 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)prim[1] * 0x10 + 6)));
  auVar49 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar25 * 0x11 + 6)));
  auVar50 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar25 * 0x1a + 6)));
  auVar51 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar25 * 0x1b + 6)));
  auVar83._16_16_ = in_YmmResult._16_16_;
  auVar37 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(prim + lVar31 + 0x12)));
  auVar38 = vsubps_avx512vl((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                            *(undefined1 (*) [16])(prim + lVar31 + 6));
  auVar52 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar25 * 0x1c + 6)));
  fVar218 = ((ray->super_RayK<1>).dir.field_0.m128[3] - *(float *)(prim + lVar31 + 0x16)) *
            *(float *)(prim + lVar31 + 0x1a);
  auVar55._8_8_ = 0;
  auVar55._0_8_ = *(ulong *)(prim + uVar25 * 7 + 6);
  auVar59 = vpmovsxwd_avx(auVar55);
  auVar39 = vpbroadcastd_avx512vl();
  auVar53._8_8_ = 0;
  auVar53._0_8_ = *(ulong *)(prim + uVar25 * 0xb + 6);
  auVar40 = vpmovsxwd_avx512vl(auVar53);
  auVar57._8_8_ = 0;
  auVar57._0_8_ = *(ulong *)(prim + uVar25 * 9 + 6);
  auVar41 = vpmovsxwd_avx512vl(auVar57);
  auVar58._8_8_ = 0;
  auVar58._0_8_ = *(ulong *)(prim + uVar25 * 0xd + 6);
  auVar42 = vpmovsxwd_avx512vl(auVar58);
  auVar54._8_8_ = 0;
  auVar54._0_8_ = *(ulong *)(prim + uVar25 * 0x12 + 6);
  auVar60 = vpmovsxwd_avx(auVar54);
  auVar61._8_8_ = 0;
  auVar61._0_8_ = *(ulong *)(prim + uVar25 * 0x16 + 6);
  auVar61 = vpmovsxwd_avx(auVar61);
  auVar62._8_8_ = 0;
  auVar62._0_8_ = *(ulong *)(prim + uVar25 * 0x14 + 6);
  auVar62 = vpmovsxwd_avx(auVar62);
  auVar63._8_8_ = 0;
  auVar63._0_8_ = *(ulong *)(prim + uVar25 * 0x18 + 6);
  auVar63 = vpmovsxwd_avx(auVar63);
  auVar38 = vmulps_avx512vl(auVar37,auVar38);
  auVar37 = vmulps_avx512vl(auVar37,(undefined1  [16])(ray->super_RayK<1>).dir.field_0);
  auVar43 = vcvtdq2ps_avx512vl(auVar47);
  auVar44 = vcvtdq2ps_avx512vl(auVar44);
  auVar45 = vcvtdq2ps_avx512vl(auVar45);
  auVar46 = vcvtdq2ps_avx512vl(auVar46);
  auVar55 = vcvtdq2ps_avx(auVar48);
  auVar53 = vcvtdq2ps_avx(auVar49);
  auVar57 = vcvtdq2ps_avx(auVar50);
  auVar58 = vcvtdq2ps_avx(auVar51);
  auVar54 = vcvtdq2ps_avx(auVar52);
  auVar47 = vbroadcastss_avx512vl(auVar37);
  auVar48 = vshufps_avx512vl(auVar37,auVar37,0x55);
  auVar49 = vshufps_avx512vl(auVar37,auVar37,0xaa);
  auVar50 = vmulps_avx512vl(auVar49,auVar45);
  auVar37._0_4_ = auVar49._0_4_ * auVar53._0_4_;
  auVar37._4_4_ = auVar49._4_4_ * auVar53._4_4_;
  auVar37._8_4_ = auVar49._8_4_ * auVar53._8_4_;
  auVar37._12_4_ = auVar49._12_4_ * auVar53._12_4_;
  auVar52._0_4_ = auVar54._0_4_ * auVar49._0_4_;
  auVar52._4_4_ = auVar54._4_4_ * auVar49._4_4_;
  auVar52._8_4_ = auVar54._8_4_ * auVar49._8_4_;
  auVar52._12_4_ = auVar54._12_4_ * auVar49._12_4_;
  auVar49 = vfmadd231ps_avx512vl(auVar50,auVar48,auVar44);
  auVar50 = vfmadd231ps_avx512vl(auVar37,auVar48,auVar55);
  auVar48 = vfmadd231ps_avx512vl(auVar52,auVar58,auVar48);
  auVar49 = vfmadd231ps_avx512vl(auVar49,auVar47,auVar43);
  auVar51 = vfmadd231ps_avx512vl(auVar50,auVar47,auVar46);
  auVar47 = vfmadd231ps_fma(auVar48,auVar57,auVar47);
  auVar48 = vbroadcastss_avx512vl(auVar38);
  auVar50 = vshufps_avx512vl(auVar38,auVar38,0x55);
  auVar52 = vshufps_avx512vl(auVar38,auVar38,0xaa);
  auVar45 = vmulps_avx512vl(auVar52,auVar45);
  auVar53 = vmulps_avx512vl(auVar52,auVar53);
  auVar54 = vmulps_avx512vl(auVar52,auVar54);
  auVar44 = vfmadd231ps_avx512vl(auVar45,auVar50,auVar44);
  auVar55 = vfmadd231ps_avx512vl(auVar53,auVar50,auVar55);
  auVar53 = vfmadd231ps_avx512vl(auVar54,auVar50,auVar58);
  auVar52 = vfmadd231ps_avx512vl(auVar44,auVar48,auVar43);
  auVar247 = ZEXT1664(auVar52);
  auVar37 = vfmadd231ps_avx512vl(auVar55,auVar48,auVar46);
  auVar50 = vfmadd231ps_fma(auVar53,auVar48,auVar57);
  auVar55 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar249 = ZEXT1664(auVar55);
  auVar53 = vandps_avx512vl(auVar49,auVar55);
  auVar169._8_4_ = 0x219392ef;
  auVar169._0_8_ = 0x219392ef219392ef;
  auVar169._12_4_ = 0x219392ef;
  uVar32 = vcmpps_avx512vl(auVar53,auVar169,1);
  bVar35 = (bool)((byte)uVar32 & 1);
  auVar38._0_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar49._0_4_;
  bVar35 = (bool)((byte)(uVar32 >> 1) & 1);
  auVar38._4_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar49._4_4_;
  bVar35 = (bool)((byte)(uVar32 >> 2) & 1);
  auVar38._8_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar49._8_4_;
  bVar35 = (bool)((byte)(uVar32 >> 3) & 1);
  auVar38._12_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar49._12_4_;
  auVar53 = vandps_avx512vl(auVar51,auVar55);
  uVar32 = vcmpps_avx512vl(auVar53,auVar169,1);
  bVar35 = (bool)((byte)uVar32 & 1);
  auVar43._0_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar51._0_4_;
  bVar35 = (bool)((byte)(uVar32 >> 1) & 1);
  auVar43._4_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar51._4_4_;
  bVar35 = (bool)((byte)(uVar32 >> 2) & 1);
  auVar43._8_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar51._8_4_;
  bVar35 = (bool)((byte)(uVar32 >> 3) & 1);
  auVar43._12_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar51._12_4_;
  auVar55 = vandps_avx512vl(auVar47,auVar55);
  uVar32 = vcmpps_avx512vl(auVar55,auVar169,1);
  bVar35 = (bool)((byte)uVar32 & 1);
  auVar56._0_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar47._0_4_;
  bVar35 = (bool)((byte)(uVar32 >> 1) & 1);
  auVar56._4_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar47._4_4_;
  bVar35 = (bool)((byte)(uVar32 >> 2) & 1);
  auVar56._8_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar47._8_4_;
  bVar35 = (bool)((byte)(uVar32 >> 3) & 1);
  auVar56._12_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar47._12_4_;
  auVar55 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar250 = ZEXT1664(auVar55);
  auVar53 = vrcp14ps_avx512vl(auVar38);
  auVar57 = vfnmadd213ps_avx512vl(auVar38,auVar53,auVar55);
  auVar57 = vfmadd132ps_fma(auVar57,auVar53,auVar53);
  auVar53 = vrcp14ps_avx512vl(auVar43);
  auVar58 = vfnmadd213ps_avx512vl(auVar43,auVar53,auVar55);
  auVar58 = vfmadd132ps_fma(auVar58,auVar53,auVar53);
  auVar53 = vrcp14ps_avx512vl(auVar56);
  auVar55 = vfnmadd213ps_avx512vl(auVar56,auVar53,auVar55);
  auVar54 = vfmadd132ps_fma(auVar55,auVar53,auVar53);
  auVar133._4_4_ = fVar218;
  auVar133._0_4_ = fVar218;
  auVar133._8_4_ = fVar218;
  auVar133._12_4_ = fVar218;
  auVar55 = vcvtdq2ps_avx(auVar59);
  auVar53 = vcvtdq2ps_avx512vl(auVar40);
  auVar53 = vsubps_avx(auVar53,auVar55);
  auVar48 = vfmadd213ps_fma(auVar53,auVar133,auVar55);
  auVar53 = vcvtdq2ps_avx512vl(auVar41);
  auVar55 = vcvtdq2ps_avx512vl(auVar42);
  auVar55 = vsubps_avx(auVar55,auVar53);
  auVar49 = vfmadd213ps_fma(auVar55,auVar133,auVar53);
  auVar55 = vcvtdq2ps_avx(auVar60);
  auVar53 = vcvtdq2ps_avx(auVar61);
  auVar53 = vsubps_avx(auVar53,auVar55);
  auVar61 = vfmadd213ps_fma(auVar53,auVar133,auVar55);
  auVar55 = vcvtdq2ps_avx(auVar62);
  auVar53 = vcvtdq2ps_avx(auVar63);
  auVar53 = vsubps_avx(auVar53,auVar55);
  auVar62 = vfmadd213ps_fma(auVar53,auVar133,auVar55);
  auVar47._8_8_ = 0;
  auVar47._0_8_ = *(ulong *)(prim + uVar25 * 0x1d + 6);
  auVar55 = vpmovsxwd_avx(auVar47);
  auVar44._8_8_ = 0;
  auVar44._0_8_ = *(ulong *)(prim + uVar25 * 0x21 + 6);
  auVar53 = vpmovsxwd_avx(auVar44);
  auVar55 = vcvtdq2ps_avx(auVar55);
  auVar53 = vcvtdq2ps_avx(auVar53);
  auVar53 = vsubps_avx(auVar53,auVar55);
  auVar63 = vfmadd213ps_fma(auVar53,auVar133,auVar55);
  auVar45._8_8_ = 0;
  auVar45._0_8_ = *(ulong *)(prim + uVar25 * 0x1f + 6);
  auVar55 = vpmovsxwd_avx(auVar45);
  auVar55 = vcvtdq2ps_avx(auVar55);
  local_250 = prim;
  auVar46._8_8_ = 0;
  auVar46._0_8_ = *(ulong *)(prim + uVar25 * 0x23 + 6);
  auVar53 = vpmovsxwd_avx(auVar46);
  auVar53 = vcvtdq2ps_avx(auVar53);
  auVar53 = vsubps_avx(auVar53,auVar55);
  auVar53 = vfmadd213ps_fma(auVar53,auVar133,auVar55);
  auVar55 = vsubps_avx512vl(auVar48,auVar52);
  auVar41._0_4_ = auVar57._0_4_ * auVar55._0_4_;
  auVar41._4_4_ = auVar57._4_4_ * auVar55._4_4_;
  auVar41._8_4_ = auVar57._8_4_ * auVar55._8_4_;
  auVar41._12_4_ = auVar57._12_4_ * auVar55._12_4_;
  auVar55 = vsubps_avx512vl(auVar49,auVar52);
  auVar40._0_4_ = auVar57._0_4_ * auVar55._0_4_;
  auVar40._4_4_ = auVar57._4_4_ * auVar55._4_4_;
  auVar40._8_4_ = auVar57._8_4_ * auVar55._8_4_;
  auVar40._12_4_ = auVar57._12_4_ * auVar55._12_4_;
  auVar55 = vsubps_avx512vl(auVar61,auVar37);
  auVar42._0_4_ = auVar58._0_4_ * auVar55._0_4_;
  auVar42._4_4_ = auVar58._4_4_ * auVar55._4_4_;
  auVar42._8_4_ = auVar58._8_4_ * auVar55._8_4_;
  auVar42._12_4_ = auVar58._12_4_ * auVar55._12_4_;
  auVar55 = vsubps_avx512vl(auVar62,auVar37);
  auVar60._0_4_ = auVar58._0_4_ * auVar55._0_4_;
  auVar60._4_4_ = auVar58._4_4_ * auVar55._4_4_;
  auVar60._8_4_ = auVar58._8_4_ * auVar55._8_4_;
  auVar60._12_4_ = auVar58._12_4_ * auVar55._12_4_;
  auVar55 = vsubps_avx(auVar63,auVar50);
  auVar160._0_4_ = auVar54._0_4_ * auVar55._0_4_;
  auVar160._4_4_ = auVar54._4_4_ * auVar55._4_4_;
  auVar160._8_4_ = auVar54._8_4_ * auVar55._8_4_;
  auVar160._12_4_ = auVar54._12_4_ * auVar55._12_4_;
  auVar55 = vsubps_avx(auVar53,auVar50);
  auVar59._0_4_ = auVar54._0_4_ * auVar55._0_4_;
  auVar59._4_4_ = auVar54._4_4_ * auVar55._4_4_;
  auVar59._8_4_ = auVar54._8_4_ * auVar55._8_4_;
  auVar59._12_4_ = auVar54._12_4_ * auVar55._12_4_;
  auVar55 = vpminsd_avx(auVar41,auVar40);
  auVar53 = vpminsd_avx(auVar42,auVar60);
  auVar55 = vmaxps_avx(auVar55,auVar53);
  auVar53 = vpminsd_avx(auVar160,auVar59);
  uVar98 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar48._4_4_ = uVar98;
  auVar48._0_4_ = uVar98;
  auVar48._8_4_ = uVar98;
  auVar48._12_4_ = uVar98;
  auVar53 = vmaxps_avx512vl(auVar53,auVar48);
  auVar55 = vmaxps_avx(auVar55,auVar53);
  auVar49._8_4_ = 0x3f7ffffa;
  auVar49._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar49._12_4_ = 0x3f7ffffa;
  local_158 = vmulps_avx512vl(auVar55,auVar49);
  auVar55 = vpmaxsd_avx(auVar41,auVar40);
  auVar53 = vpmaxsd_avx(auVar42,auVar60);
  auVar55 = vminps_avx(auVar55,auVar53);
  auVar53 = vpmaxsd_avx(auVar160,auVar59);
  fVar218 = (ray->super_RayK<1>).tfar;
  auVar50._4_4_ = fVar218;
  auVar50._0_4_ = fVar218;
  auVar50._8_4_ = fVar218;
  auVar50._12_4_ = fVar218;
  auVar53 = vminps_avx512vl(auVar53,auVar50);
  auVar55 = vminps_avx(auVar55,auVar53);
  auVar51._8_4_ = 0x3f800003;
  auVar51._0_8_ = 0x3f8000033f800003;
  auVar51._12_4_ = 0x3f800003;
  auVar55 = vmulps_avx512vl(auVar55,auVar51);
  uVar14 = vcmpps_avx512vl(local_158,auVar55,2);
  uVar15 = vpcmpgtd_avx512vl(auVar39,_DAT_01f4ad30);
  uVar32 = (ulong)((byte)uVar14 & 0xf & (byte)uVar15);
  auVar55 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
  auVar252 = ZEXT1664(auVar55);
  auVar83._0_16_ = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar248 = ZEXT1664(auVar83._0_16_);
LAB_018f0749:
  if (uVar32 == 0) {
    return;
  }
  lVar31 = 0;
  for (uVar25 = uVar32; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x8000000000000000) {
    lVar31 = lVar31 + 1;
  }
  uVar6 = *(uint *)(local_250 + 2);
  pGVar8 = (context->scene->geometries).items[uVar6].ptr;
  fVar218 = (pGVar8->time_range).lower;
  fVar213 = pGVar8->fnumTimeSegments *
            (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar218) /
            ((pGVar8->time_range).upper - fVar218));
  auVar55 = vroundss_avx(ZEXT416((uint)fVar213),ZEXT416((uint)fVar213),9);
  auVar79._16_16_ = auVar83._16_16_;
  auVar53 = vaddss_avx512f(ZEXT416((uint)pGVar8->fnumTimeSegments),SUB6416(ZEXT464(0xbf800000),0));
  auVar55 = vminss_avx(auVar55,auVar53);
  auVar51 = vmaxss_avx512f(auVar252._0_16_,auVar55);
  local_2f0 = (ulong)*(uint *)(local_250 + lVar31 * 4 + 6);
  uVar25 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                           (ulong)*(uint *)(local_250 + lVar31 * 4 + 6) *
                           pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var9 = pGVar8[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar29 = (long)(int)auVar51._0_4_ * 0x38;
  lVar10 = *(long *)(_Var9 + lVar29);
  lVar11 = *(long *)(_Var9 + 0x10 + lVar29);
  auVar55 = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar25);
  lVar31 = uVar25 + 1;
  auVar53 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar31);
  lVar27 = uVar25 + 2;
  auVar57 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar27);
  lVar1 = uVar25 + 3;
  auVar58 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar1);
  lVar10 = *(long *)&pGVar8[4].fnumTimeSegments;
  lVar11 = *(long *)(lVar10 + lVar29);
  lVar12 = *(long *)(lVar10 + 0x10 + lVar29);
  auVar54 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar25);
  auVar61 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar31);
  auVar62 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar27);
  auVar63 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar1);
  lVar11 = *(long *)(_Var9 + 0x38 + lVar29);
  lVar12 = *(long *)(_Var9 + 0x48 + lVar29);
  auVar47 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar25);
  auVar44 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar31);
  auVar45 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar27);
  auVar46 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar1);
  lVar11 = *(long *)(lVar10 + 0x38 + lVar29);
  lVar10 = *(long *)(lVar10 + 0x48 + lVar29);
  auVar48 = *(undefined1 (*) [16])(lVar11 + uVar25 * lVar10);
  auVar49 = *(undefined1 (*) [16])(lVar11 + lVar31 * lVar10);
  auVar50 = *(undefined1 (*) [16])(lVar11 + lVar27 * lVar10);
  fVar213 = fVar213 - auVar51._0_4_;
  auVar79._0_16_ = vxorps_avx512vl(auVar247._0_16_,auVar247._0_16_);
  auVar51 = vmulps_avx512vl(auVar58,auVar79._0_16_);
  auVar52 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaab));
  auVar59 = vfmadd213ps_avx512vl(auVar52,auVar57,auVar51);
  auVar60 = vbroadcastss_avx512vl(ZEXT416(0x3f2aaaab));
  auVar59 = vfmadd231ps_avx512vl(auVar59,auVar53,auVar60);
  auVar59 = vfmadd231ps_avx512vl(auVar59,auVar55,auVar52);
  auVar43 = auVar248._0_16_;
  auVar51 = vfmadd231ps_avx512vl(auVar51,auVar57,auVar43);
  auVar51 = vfnmadd231ps_avx512vl(auVar51,auVar53,auVar79._0_16_);
  auVar51 = vfnmadd231ps_avx512vl(auVar51,auVar55,auVar43);
  auVar37 = vmulps_avx512vl(auVar63,auVar79._0_16_);
  auVar38 = vfmadd213ps_avx512vl(auVar52,auVar62,auVar37);
  auVar38 = vfmadd231ps_avx512vl(auVar38,auVar61,auVar60);
  auVar38 = vfmadd231ps_avx512vl(auVar38,auVar54,auVar52);
  auVar37 = vfmadd231ps_avx512vl(auVar37,auVar62,auVar43);
  auVar37 = vfnmadd231ps_avx512vl(auVar37,auVar61,auVar79._0_16_);
  auVar37 = vfnmadd231ps_avx512vl(auVar37,auVar54,auVar43);
  auVar39 = vmulps_avx512vl(auVar58,auVar52);
  auVar39 = vfmadd231ps_avx512vl(auVar39,auVar57,auVar60);
  auVar39 = vfmadd231ps_avx512vl(auVar39,auVar53,auVar52);
  auVar39 = vfmadd231ps_avx512vl(auVar39,auVar55,auVar79._0_16_);
  auVar58 = vmulps_avx512vl(auVar58,auVar43);
  auVar57 = vfmadd231ps_avx512vl(auVar58,auVar79._0_16_,auVar57);
  auVar53 = vfnmadd231ps_avx512vl(auVar57,auVar43,auVar53);
  auVar40 = vfnmadd231ps_avx512vl(auVar53,auVar79._0_16_,auVar55);
  auVar55 = vmulps_avx512vl(auVar63,auVar52);
  auVar55 = vfmadd231ps_avx512vl(auVar55,auVar62,auVar60);
  auVar55 = vfmadd231ps_avx512vl(auVar55,auVar61,auVar52);
  auVar41 = vfmadd231ps_avx512vl(auVar55,auVar54,auVar79._0_16_);
  auVar55 = vmulps_avx512vl(auVar63,auVar43);
  auVar55 = vfmadd231ps_avx512vl(auVar55,auVar79._0_16_,auVar62);
  auVar55 = vfnmadd231ps_avx512vl(auVar55,auVar43,auVar61);
  auVar61 = vfnmadd231ps_avx512vl(auVar55,auVar79._0_16_,auVar54);
  auVar53 = vshufps_avx512vl(auVar51,auVar51,0xc9);
  auVar55 = vshufps_avx512vl(auVar38,auVar38,0xc9);
  auVar55 = vmulps_avx512vl(auVar51,auVar55);
  auVar55 = vfmsub231ps_avx512vl(auVar55,auVar53,auVar38);
  auVar57 = vshufps_avx(auVar55,auVar55,0xc9);
  auVar55 = vshufps_avx(auVar37,auVar37,0xc9);
  auVar55 = vmulps_avx512vl(auVar51,auVar55);
  auVar55 = vfmsub231ps_fma(auVar55,auVar53,auVar37);
  auVar58 = vshufps_avx(auVar55,auVar55,0xc9);
  auVar55 = vshufps_avx(auVar40,auVar40,0xc9);
  auVar53 = vshufps_avx(auVar41,auVar41,0xc9);
  fVar216 = auVar40._0_4_;
  auVar148._0_4_ = fVar216 * auVar53._0_4_;
  fVar217 = auVar40._4_4_;
  auVar148._4_4_ = fVar217 * auVar53._4_4_;
  fVar159 = auVar40._8_4_;
  auVar148._8_4_ = fVar159 * auVar53._8_4_;
  fVar168 = auVar40._12_4_;
  auVar148._12_4_ = fVar168 * auVar53._12_4_;
  auVar53 = vfmsub231ps_fma(auVar148,auVar55,auVar41);
  auVar54 = vshufps_avx(auVar53,auVar53,0xc9);
  auVar53 = vshufps_avx(auVar61,auVar61,0xc9);
  auVar149._0_4_ = fVar216 * auVar53._0_4_;
  auVar149._4_4_ = fVar217 * auVar53._4_4_;
  auVar149._8_4_ = fVar159 * auVar53._8_4_;
  auVar149._12_4_ = fVar168 * auVar53._12_4_;
  auVar53 = vfmsub231ps_fma(auVar149,auVar55,auVar61);
  auVar55 = vdpps_avx(auVar57,auVar57,0x7f);
  auVar61 = vshufps_avx(auVar53,auVar53,0xc9);
  auVar64._4_28_ = auVar79._4_28_;
  auVar64._0_4_ = auVar55._0_4_;
  auVar53 = vrsqrt14ss_avx512f(auVar79._0_16_,auVar64._0_16_);
  auVar62 = vmulss_avx512f(auVar53,ZEXT416(0x3fc00000));
  auVar63 = vmulss_avx512f(auVar55,ZEXT416(0xbf000000));
  auVar63 = vmulss_avx512f(auVar63,auVar53);
  auVar63 = vmulss_avx512f(auVar63,ZEXT416((uint)(auVar53._0_4_ * auVar53._0_4_)));
  auVar53 = vdpps_avx(auVar57,auVar58,0x7f);
  fVar218 = auVar62._0_4_ + auVar63._0_4_;
  fVar177 = fVar218 * auVar57._0_4_;
  fVar191 = fVar218 * auVar57._4_4_;
  fVar192 = fVar218 * auVar57._8_4_;
  fVar193 = fVar218 * auVar57._12_4_;
  auVar62 = vbroadcastss_avx512vl(auVar55);
  auVar58 = vmulps_avx512vl(auVar62,auVar58);
  fVar202 = auVar53._0_4_;
  auVar99._0_4_ = fVar202 * auVar57._0_4_;
  auVar99._4_4_ = fVar202 * auVar57._4_4_;
  auVar99._8_4_ = fVar202 * auVar57._8_4_;
  auVar99._12_4_ = fVar202 * auVar57._12_4_;
  auVar57 = vsubps_avx(auVar58,auVar99);
  auVar53 = vrcp14ss_avx512f(auVar79._0_16_,auVar64._0_16_);
  auVar55 = vfnmadd213ss_avx512f(auVar55,auVar53,ZEXT416(0x40000000));
  fVar214 = auVar53._0_4_ * auVar55._0_4_;
  auVar55 = vdpps_avx(auVar54,auVar54,0x7f);
  auVar82._16_16_ = auVar79._16_16_;
  auVar82._0_16_ = auVar79._0_16_;
  auVar65._4_28_ = auVar82._4_28_;
  auVar65._0_4_ = auVar55._0_4_;
  auVar53 = vrsqrt14ss_avx512f(auVar79._0_16_,auVar65._0_16_);
  auVar58 = vmulss_avx512f(auVar53,ZEXT416(0x3fc00000));
  auVar62 = vmulss_avx512f(auVar55,ZEXT416(0xbf000000));
  fVar202 = auVar53._0_4_;
  fVar202 = auVar58._0_4_ + auVar62._0_4_ * fVar202 * fVar202 * fVar202;
  auVar53 = vdpps_avx(auVar54,auVar61,0x7f);
  auVar170._0_4_ = auVar54._0_4_ * fVar202;
  auVar170._4_4_ = auVar54._4_4_ * fVar202;
  auVar170._8_4_ = auVar54._8_4_ * fVar202;
  auVar170._12_4_ = auVar54._12_4_ * fVar202;
  auVar58 = vbroadcastss_avx512vl(auVar55);
  auVar58 = vmulps_avx512vl(auVar58,auVar61);
  fVar215 = auVar53._0_4_;
  auVar111._0_4_ = fVar215 * auVar54._0_4_;
  auVar111._4_4_ = fVar215 * auVar54._4_4_;
  auVar111._8_4_ = fVar215 * auVar54._8_4_;
  auVar111._12_4_ = fVar215 * auVar54._12_4_;
  auVar53 = vsubps_avx(auVar58,auVar111);
  auVar58 = vrcp14ss_avx512f(auVar79._0_16_,auVar65._0_16_);
  auVar55 = vfnmadd213ss_avx512f(auVar55,auVar58,ZEXT416(0x40000000));
  fVar215 = auVar58._0_4_ * auVar55._0_4_;
  auVar55 = vshufps_avx512vl(auVar59,auVar59,0xff);
  auVar128._0_4_ = fVar177 * auVar55._0_4_;
  auVar128._4_4_ = fVar191 * auVar55._4_4_;
  auVar128._8_4_ = fVar192 * auVar55._8_4_;
  auVar128._12_4_ = fVar193 * auVar55._12_4_;
  auVar37 = vsubps_avx512vl(auVar59,auVar128);
  auVar58 = vshufps_avx512vl(auVar51,auVar51,0xff);
  auVar100._0_4_ = fVar177 * auVar58._0_4_ + auVar55._0_4_ * fVar218 * fVar214 * auVar57._0_4_;
  auVar100._4_4_ = fVar191 * auVar58._4_4_ + auVar55._4_4_ * fVar218 * fVar214 * auVar57._4_4_;
  auVar100._8_4_ = fVar192 * auVar58._8_4_ + auVar55._8_4_ * fVar218 * fVar214 * auVar57._8_4_;
  auVar100._12_4_ = fVar193 * auVar58._12_4_ + auVar55._12_4_ * fVar218 * fVar214 * auVar57._12_4_;
  auVar57 = vsubps_avx512vl(auVar51,auVar100);
  auVar59 = vaddps_avx512vl(auVar59,auVar128);
  auVar58 = vaddps_avx512vl(auVar51,auVar100);
  auVar55 = vshufps_avx512vl(auVar39,auVar39,0xff);
  auVar178._0_4_ = auVar170._0_4_ * auVar55._0_4_;
  auVar178._4_4_ = auVar170._4_4_ * auVar55._4_4_;
  auVar178._8_4_ = auVar170._8_4_ * auVar55._8_4_;
  auVar178._12_4_ = auVar170._12_4_ * auVar55._12_4_;
  auVar51 = vsubps_avx512vl(auVar39,auVar178);
  auVar54 = vshufps_avx512vl(auVar40,auVar40,0xff);
  auVar54 = vmulps_avx512vl(auVar54,auVar170);
  auVar150._0_4_ = auVar54._0_4_ + auVar55._0_4_ * fVar202 * auVar53._0_4_ * fVar215;
  auVar150._4_4_ = auVar54._4_4_ + auVar55._4_4_ * fVar202 * auVar53._4_4_ * fVar215;
  auVar150._8_4_ = auVar54._8_4_ + auVar55._8_4_ * fVar202 * auVar53._8_4_ * fVar215;
  auVar150._12_4_ = auVar54._12_4_ + auVar55._12_4_ * fVar202 * auVar53._12_4_ * fVar215;
  auVar55 = vsubps_avx(auVar40,auVar150);
  auVar38 = vaddps_avx512vl(auVar39,auVar178);
  auVar161._0_4_ = auVar37._0_4_ + auVar57._0_4_ * 0.33333334;
  auVar161._4_4_ = auVar37._4_4_ + auVar57._4_4_ * 0.33333334;
  auVar161._8_4_ = auVar37._8_4_ + auVar57._8_4_ * 0.33333334;
  auVar161._12_4_ = auVar37._12_4_ + auVar57._12_4_ * 0.33333334;
  auVar134._0_4_ = auVar55._0_4_ * 0.33333334;
  auVar134._4_4_ = auVar55._4_4_ * 0.33333334;
  auVar134._8_4_ = auVar55._8_4_ * 0.33333334;
  auVar134._12_4_ = auVar55._12_4_ * 0.33333334;
  auVar62 = vsubps_avx(auVar51,auVar134);
  auVar101._0_4_ = auVar58._0_4_ * 0.33333334;
  auVar101._4_4_ = auVar58._4_4_ * 0.33333334;
  auVar101._8_4_ = auVar58._8_4_ * 0.33333334;
  auVar101._12_4_ = auVar58._12_4_ * 0.33333334;
  auVar39 = vaddps_avx512vl(auVar59,auVar101);
  auVar102._0_4_ = (fVar216 + auVar150._0_4_) * 0.33333334;
  auVar102._4_4_ = (fVar217 + auVar150._4_4_) * 0.33333334;
  auVar102._8_4_ = (fVar159 + auVar150._8_4_) * 0.33333334;
  auVar102._12_4_ = (fVar168 + auVar150._12_4_) * 0.33333334;
  auVar55 = *(undefined1 (*) [16])(lVar11 + lVar10 * lVar1);
  auVar63 = vsubps_avx(auVar38,auVar102);
  auVar53 = vmulps_avx512vl(auVar46,auVar79._0_16_);
  auVar57 = vfmadd213ps_avx512vl(auVar52,auVar45,auVar53);
  auVar57 = vfmadd231ps_avx512vl(auVar57,auVar44,auVar60);
  auVar40 = vfmadd231ps_avx512vl(auVar57,auVar47,auVar52);
  auVar53 = vfmadd231ps_avx512vl(auVar53,auVar45,auVar43);
  auVar53 = vfnmadd231ps_avx512vl(auVar53,auVar44,auVar79._0_16_);
  auVar41 = vfnmadd231ps_avx512vl(auVar53,auVar47,auVar43);
  auVar53 = vmulps_avx512vl(auVar55,auVar79._0_16_);
  auVar57 = vfmadd213ps_avx512vl(auVar52,auVar50,auVar53);
  auVar57 = vfmadd231ps_avx512vl(auVar57,auVar49,auVar60);
  auVar57 = vfmadd231ps_avx512vl(auVar57,auVar48,auVar52);
  auVar53 = vfmadd231ps_avx512vl(auVar53,auVar50,auVar43);
  auVar53 = vfnmadd231ps_avx512vl(auVar53,auVar49,auVar79._0_16_);
  auVar58 = vfnmadd231ps_avx512vl(auVar53,auVar48,auVar43);
  auVar53 = vmulps_avx512vl(auVar46,auVar52);
  auVar53 = vfmadd231ps_avx512vl(auVar53,auVar45,auVar60);
  auVar53 = vfmadd231ps_avx512vl(auVar53,auVar44,auVar52);
  auVar42 = vfmadd231ps_avx512vl(auVar53,auVar47,auVar79._0_16_);
  auVar53 = vmulps_avx512vl(auVar46,auVar43);
  auVar53 = vfmadd231ps_avx512vl(auVar53,auVar79._0_16_,auVar45);
  auVar53 = vfnmadd231ps_avx512vl(auVar53,auVar43,auVar44);
  auVar47 = vfnmadd231ps_avx512vl(auVar53,auVar79._0_16_,auVar47);
  auVar53 = vmulps_avx512vl(auVar55,auVar52);
  auVar53 = vfmadd231ps_avx512vl(auVar53,auVar50,auVar60);
  auVar53 = vfmadd231ps_avx512vl(auVar53,auVar49,auVar52);
  auVar54 = vfmadd231ps_avx512vl(auVar53,auVar48,auVar79._0_16_);
  auVar55 = vmulps_avx512vl(auVar55,auVar43);
  auVar55 = vfmadd231ps_avx512vl(auVar55,auVar79._0_16_,auVar50);
  auVar55 = vfnmadd231ps_avx512vl(auVar55,auVar43,auVar49);
  auVar61 = vfnmadd231ps_avx512vl(auVar55,auVar79._0_16_,auVar48);
  auVar55 = vshufps_avx(auVar41,auVar41,0xc9);
  auVar53 = vshufps_avx512vl(auVar57,auVar57,0xc9);
  fVar215 = auVar41._0_4_;
  auVar219._0_4_ = fVar215 * auVar53._0_4_;
  fVar216 = auVar41._4_4_;
  auVar219._4_4_ = fVar216 * auVar53._4_4_;
  fVar217 = auVar41._8_4_;
  auVar219._8_4_ = fVar217 * auVar53._8_4_;
  fVar159 = auVar41._12_4_;
  auVar219._12_4_ = fVar159 * auVar53._12_4_;
  auVar53 = vfmsub231ps_avx512vl(auVar219,auVar55,auVar57);
  auVar57 = vshufps_avx(auVar53,auVar53,0xc9);
  auVar53 = vshufps_avx(auVar58,auVar58,0xc9);
  auVar226._0_4_ = fVar215 * auVar53._0_4_;
  auVar226._4_4_ = fVar216 * auVar53._4_4_;
  auVar226._8_4_ = fVar217 * auVar53._8_4_;
  auVar226._12_4_ = fVar159 * auVar53._12_4_;
  auVar55 = vfmsub231ps_fma(auVar226,auVar55,auVar58);
  auVar58 = vshufps_avx(auVar55,auVar55,0xc9);
  auVar53 = vshufps_avx512vl(auVar47,auVar47,0xc9);
  auVar55 = vshufps_avx(auVar54,auVar54,0xc9);
  auVar55 = vmulps_avx512vl(auVar47,auVar55);
  auVar55 = vfmsub231ps_fma(auVar55,auVar53,auVar54);
  auVar54 = vshufps_avx(auVar55,auVar55,0xc9);
  auVar55 = vshufps_avx(auVar61,auVar61,0xc9);
  auVar55 = vmulps_avx512vl(auVar47,auVar55);
  auVar55 = vfmsub231ps_fma(auVar55,auVar53,auVar61);
  auVar61 = vshufps_avx(auVar55,auVar55,0xc9);
  auVar55 = vdpps_avx(auVar57,auVar57,0x7f);
  auVar66._16_16_ = auVar79._16_16_;
  auVar66._0_16_ = auVar79._0_16_;
  auVar67._4_28_ = auVar66._4_28_;
  auVar67._0_4_ = auVar55._0_4_;
  auVar53 = vrsqrt14ss_avx512f(auVar79._0_16_,auVar67._0_16_);
  auVar44 = vmulss_avx512f(auVar53,ZEXT416(0x3fc00000));
  auVar45 = vmulss_avx512f(auVar55,ZEXT416(0xbf000000));
  auVar45 = vmulss_avx512f(auVar45,auVar53);
  auVar53 = vmulss_avx512f(auVar45,ZEXT416((uint)(auVar53._0_4_ * auVar53._0_4_)));
  auVar53 = vaddss_avx512f(auVar44,auVar53);
  auVar238._0_4_ = auVar53._0_4_;
  auVar238._4_4_ = auVar238._0_4_;
  auVar238._8_4_ = auVar238._0_4_;
  auVar238._12_4_ = auVar238._0_4_;
  auVar53 = vdpps_avx(auVar57,auVar58,0x7f);
  auVar44 = vmulps_avx512vl(auVar57,auVar238);
  auVar45 = vbroadcastss_avx512vl(auVar55);
  auVar58 = vmulps_avx512vl(auVar45,auVar58);
  fVar218 = auVar53._0_4_;
  auVar135._0_4_ = auVar57._0_4_ * fVar218;
  auVar135._4_4_ = auVar57._4_4_ * fVar218;
  auVar135._8_4_ = auVar57._8_4_ * fVar218;
  auVar135._12_4_ = auVar57._12_4_ * fVar218;
  auVar57 = vsubps_avx(auVar58,auVar135);
  auVar53 = vrcp14ss_avx512f(auVar79._0_16_,auVar67._0_16_);
  auVar55 = vfnmadd213ss_avx512f(auVar55,auVar53,ZEXT416(0x40000000));
  fVar202 = auVar55._0_4_ * auVar53._0_4_;
  auVar55 = vdpps_avx(auVar54,auVar54,0x7f);
  auVar68._16_16_ = auVar79._16_16_;
  auVar68._0_16_ = auVar79._0_16_;
  auVar69._4_28_ = auVar68._4_28_;
  auVar69._0_4_ = auVar55._0_4_;
  auVar53 = vrsqrt14ss_avx512f(auVar79._0_16_,auVar69._0_16_);
  auVar58 = vmulss_avx512f(auVar53,ZEXT416(0x3fc00000));
  auVar251 = ZEXT464(0x3f800000);
  auVar45 = vmulss_avx512f(auVar55,ZEXT416(0xbf000000));
  fVar218 = auVar53._0_4_;
  fVar218 = auVar58._0_4_ + auVar45._0_4_ * fVar218 * fVar218 * fVar218;
  auVar232._0_4_ = auVar54._0_4_ * fVar218;
  auVar232._4_4_ = auVar54._4_4_ * fVar218;
  auVar232._8_4_ = auVar54._8_4_ * fVar218;
  auVar232._12_4_ = auVar54._12_4_ * fVar218;
  auVar53 = vdpps_avx(auVar54,auVar61,0x7f);
  auVar58 = vbroadcastss_avx512vl(auVar55);
  auVar58 = vmulps_avx512vl(auVar58,auVar61);
  fVar214 = auVar53._0_4_;
  auVar194._0_4_ = fVar214 * auVar54._0_4_;
  auVar194._4_4_ = fVar214 * auVar54._4_4_;
  auVar194._8_4_ = fVar214 * auVar54._8_4_;
  auVar194._12_4_ = fVar214 * auVar54._12_4_;
  auVar53 = vsubps_avx(auVar58,auVar194);
  auVar58 = vrcp14ss_avx512f(auVar79._0_16_,auVar69._0_16_);
  auVar55 = vfnmadd213ss_avx512f(auVar55,auVar58,ZEXT416(0x40000000));
  fVar214 = auVar58._0_4_ * auVar55._0_4_;
  auVar58 = vshufps_avx512vl(auVar40,auVar40,0xff);
  auVar54 = vmulps_avx512vl(auVar58,auVar44);
  auVar61 = vsubps_avx512vl(auVar40,auVar54);
  auVar55 = vshufps_avx(auVar41,auVar41,0xff);
  auVar55 = vmulps_avx512vl(auVar55,auVar44);
  auVar103._0_4_ = auVar55._0_4_ + auVar58._0_4_ * auVar238._0_4_ * fVar202 * auVar57._0_4_;
  auVar103._4_4_ = auVar55._4_4_ + auVar58._4_4_ * auVar238._0_4_ * fVar202 * auVar57._4_4_;
  auVar103._8_4_ = auVar55._8_4_ + auVar58._8_4_ * auVar238._0_4_ * fVar202 * auVar57._8_4_;
  auVar103._12_4_ = auVar55._12_4_ + auVar58._12_4_ * auVar238._0_4_ * fVar202 * auVar57._12_4_;
  auVar55 = vsubps_avx(auVar41,auVar103);
  auVar57 = vaddps_avx512vl(auVar40,auVar54);
  auVar58 = vshufps_avx512vl(auVar42,auVar42,0xff);
  auVar227._0_4_ = auVar58._0_4_ * auVar232._0_4_;
  auVar227._4_4_ = auVar58._4_4_ * auVar232._4_4_;
  auVar227._8_4_ = auVar58._8_4_ * auVar232._8_4_;
  auVar227._12_4_ = auVar58._12_4_ * auVar232._12_4_;
  auVar54 = vsubps_avx512vl(auVar42,auVar227);
  auVar44 = vshufps_avx512vl(auVar47,auVar47,0xff);
  auVar44 = vmulps_avx512vl(auVar44,auVar232);
  auVar136._0_4_ = auVar44._0_4_ + auVar58._0_4_ * fVar218 * auVar53._0_4_ * fVar214;
  auVar136._4_4_ = auVar44._4_4_ + auVar58._4_4_ * fVar218 * auVar53._4_4_ * fVar214;
  auVar136._8_4_ = auVar44._8_4_ + auVar58._8_4_ * fVar218 * auVar53._8_4_ * fVar214;
  auVar136._12_4_ = auVar44._12_4_ + auVar58._12_4_ * fVar218 * auVar53._12_4_ * fVar214;
  auVar53 = vsubps_avx512vl(auVar47,auVar136);
  auVar58 = vaddps_avx512vl(auVar42,auVar227);
  auVar47 = vaddps_avx512vl(auVar47,auVar136);
  auVar195._0_4_ = auVar61._0_4_ + auVar55._0_4_ * 0.33333334;
  auVar195._4_4_ = auVar61._4_4_ + auVar55._4_4_ * 0.33333334;
  auVar195._8_4_ = auVar61._8_4_ + auVar55._8_4_ * 0.33333334;
  auVar195._12_4_ = auVar61._12_4_ + auVar55._12_4_ * 0.33333334;
  auVar179._0_4_ = auVar53._0_4_ * 0.33333334;
  auVar179._4_4_ = auVar53._4_4_ * 0.33333334;
  auVar179._8_4_ = auVar53._8_4_ * 0.33333334;
  auVar179._12_4_ = auVar53._12_4_ * 0.33333334;
  auVar55 = vsubps_avx(auVar54,auVar179);
  auVar104._0_4_ = auVar57._0_4_ + (fVar215 + auVar103._0_4_) * 0.33333334;
  auVar104._4_4_ = auVar57._4_4_ + (fVar216 + auVar103._4_4_) * 0.33333334;
  auVar104._8_4_ = auVar57._8_4_ + (fVar217 + auVar103._8_4_) * 0.33333334;
  auVar104._12_4_ = auVar57._12_4_ + (fVar159 + auVar103._12_4_) * 0.33333334;
  auVar137._0_4_ = auVar47._0_4_ * 0.33333334;
  auVar137._4_4_ = auVar47._4_4_ * 0.33333334;
  auVar137._8_4_ = auVar47._8_4_ * 0.33333334;
  auVar137._12_4_ = auVar47._12_4_ * 0.33333334;
  auVar53 = vsubps_avx(auVar58,auVar137);
  auVar233._4_4_ = fVar213;
  auVar233._0_4_ = fVar213;
  auVar233._8_4_ = fVar213;
  auVar233._12_4_ = fVar213;
  auVar47 = vsubss_avx512f(ZEXT416(0x3f800000),ZEXT416((uint)fVar213));
  auVar47 = vbroadcastss_avx512vl(auVar47);
  auVar61 = vmulps_avx512vl(auVar233,auVar61);
  auVar44 = vmulps_avx512vl(auVar233,auVar195);
  auVar55 = vmulps_avx512vl(auVar233,auVar55);
  auVar239._0_4_ = fVar213 * auVar54._0_4_;
  auVar239._4_4_ = fVar213 * auVar54._4_4_;
  auVar239._8_4_ = fVar213 * auVar54._8_4_;
  auVar239._12_4_ = fVar213 * auVar54._12_4_;
  local_1a8 = vfmadd231ps_avx512vl(auVar61,auVar47,auVar37);
  local_1b8 = vfmadd231ps_avx512vl(auVar44,auVar47,auVar161);
  local_1c8 = vfmadd231ps_avx512vl(auVar55,auVar47,auVar62);
  local_1d8 = vfmadd231ps_avx512vl(auVar239,auVar47,auVar51);
  auVar55 = vmulps_avx512vl(auVar233,auVar57);
  auVar57 = vmulps_avx512vl(auVar233,auVar104);
  auVar53 = vmulps_avx512vl(auVar233,auVar53);
  auVar228._0_4_ = fVar213 * auVar58._0_4_;
  auVar228._4_4_ = fVar213 * auVar58._4_4_;
  auVar228._8_4_ = fVar213 * auVar58._8_4_;
  auVar228._12_4_ = fVar213 * auVar58._12_4_;
  _local_1e8 = vfmadd231ps_avx512vl(auVar55,auVar47,auVar59);
  _local_1f8 = vfmadd231ps_avx512vl(auVar57,auVar47,auVar39);
  _local_208 = vfmadd231ps_avx512vl(auVar53,auVar47,auVar63);
  _local_218 = vfmadd231ps_avx512vl(auVar228,auVar47,auVar38);
  aVar3 = (ray->super_RayK<1>).org.field_0;
  auVar53 = vsubps_avx512vl(local_1a8,(undefined1  [16])aVar3);
  uVar98 = auVar53._0_4_;
  auVar112._4_4_ = uVar98;
  auVar112._0_4_ = uVar98;
  auVar112._8_4_ = uVar98;
  auVar112._12_4_ = uVar98;
  auVar55 = vshufps_avx(auVar53,auVar53,0x55);
  auVar53 = vshufps_avx(auVar53,auVar53,0xaa);
  aVar4 = (pre->ray_space).vx.field_0;
  aVar5 = (pre->ray_space).vy.field_0;
  fVar218 = (pre->ray_space).vz.field_0.m128[0];
  fVar202 = (pre->ray_space).vz.field_0.m128[1];
  fVar213 = (pre->ray_space).vz.field_0.m128[2];
  fVar214 = (pre->ray_space).vz.field_0.m128[3];
  auVar105._0_4_ = fVar218 * auVar53._0_4_;
  auVar105._4_4_ = fVar202 * auVar53._4_4_;
  auVar105._8_4_ = fVar213 * auVar53._8_4_;
  auVar105._12_4_ = fVar214 * auVar53._12_4_;
  auVar55 = vfmadd231ps_fma(auVar105,(undefined1  [16])aVar5,auVar55);
  auVar54 = vfmadd231ps_fma(auVar55,(undefined1  [16])aVar4,auVar112);
  auVar53 = vsubps_avx512vl(local_1b8,(undefined1  [16])aVar3);
  uVar98 = auVar53._0_4_;
  auVar115._4_4_ = uVar98;
  auVar115._0_4_ = uVar98;
  auVar115._8_4_ = uVar98;
  auVar115._12_4_ = uVar98;
  auVar55 = vshufps_avx(auVar53,auVar53,0x55);
  auVar53 = vshufps_avx(auVar53,auVar53,0xaa);
  auVar113._0_4_ = fVar218 * auVar53._0_4_;
  auVar113._4_4_ = fVar202 * auVar53._4_4_;
  auVar113._8_4_ = fVar213 * auVar53._8_4_;
  auVar113._12_4_ = fVar214 * auVar53._12_4_;
  auVar55 = vfmadd231ps_fma(auVar113,(undefined1  [16])aVar5,auVar55);
  auVar61 = vfmadd231ps_fma(auVar55,(undefined1  [16])aVar4,auVar115);
  auVar53 = vsubps_avx512vl(local_1c8,(undefined1  [16])aVar3);
  uVar98 = auVar53._0_4_;
  auVar151._4_4_ = uVar98;
  auVar151._0_4_ = uVar98;
  auVar151._8_4_ = uVar98;
  auVar151._12_4_ = uVar98;
  auVar55 = vshufps_avx(auVar53,auVar53,0x55);
  auVar53 = vshufps_avx(auVar53,auVar53,0xaa);
  auVar116._0_4_ = fVar218 * auVar53._0_4_;
  auVar116._4_4_ = fVar202 * auVar53._4_4_;
  auVar116._8_4_ = fVar213 * auVar53._8_4_;
  auVar116._12_4_ = fVar214 * auVar53._12_4_;
  auVar55 = vfmadd231ps_fma(auVar116,(undefined1  [16])aVar5,auVar55);
  auVar62 = vfmadd231ps_fma(auVar55,(undefined1  [16])aVar4,auVar151);
  auVar53 = vsubps_avx(local_1d8,(undefined1  [16])aVar3);
  uVar98 = auVar53._0_4_;
  auVar171._4_4_ = uVar98;
  auVar171._0_4_ = uVar98;
  auVar171._8_4_ = uVar98;
  auVar171._12_4_ = uVar98;
  auVar55 = vshufps_avx(auVar53,auVar53,0x55);
  auVar53 = vshufps_avx(auVar53,auVar53,0xaa);
  auVar152._0_4_ = fVar218 * auVar53._0_4_;
  auVar152._4_4_ = fVar202 * auVar53._4_4_;
  auVar152._8_4_ = fVar213 * auVar53._8_4_;
  auVar152._12_4_ = fVar214 * auVar53._12_4_;
  auVar55 = vfmadd231ps_fma(auVar152,(undefined1  [16])aVar5,auVar55);
  auVar63 = vfmadd231ps_fma(auVar55,(undefined1  [16])aVar4,auVar171);
  auVar53 = vsubps_avx512vl(_local_1e8,(undefined1  [16])aVar3);
  uVar98 = auVar53._0_4_;
  auVar180._4_4_ = uVar98;
  auVar180._0_4_ = uVar98;
  auVar180._8_4_ = uVar98;
  auVar180._12_4_ = uVar98;
  auVar55 = vshufps_avx(auVar53,auVar53,0x55);
  auVar53 = vshufps_avx(auVar53,auVar53,0xaa);
  auVar172._0_4_ = auVar53._0_4_ * fVar218;
  auVar172._4_4_ = auVar53._4_4_ * fVar202;
  auVar172._8_4_ = auVar53._8_4_ * fVar213;
  auVar172._12_4_ = auVar53._12_4_ * fVar214;
  auVar55 = vfmadd231ps_fma(auVar172,(undefined1  [16])aVar5,auVar55);
  auVar47 = vfmadd231ps_fma(auVar55,(undefined1  [16])aVar4,auVar180);
  auVar53 = vsubps_avx512vl(_local_1f8,(undefined1  [16])aVar3);
  uVar98 = auVar53._0_4_;
  auVar196._4_4_ = uVar98;
  auVar196._0_4_ = uVar98;
  auVar196._8_4_ = uVar98;
  auVar196._12_4_ = uVar98;
  auVar55 = vshufps_avx(auVar53,auVar53,0x55);
  auVar53 = vshufps_avx(auVar53,auVar53,0xaa);
  auVar181._0_4_ = auVar53._0_4_ * fVar218;
  auVar181._4_4_ = auVar53._4_4_ * fVar202;
  auVar181._8_4_ = auVar53._8_4_ * fVar213;
  auVar181._12_4_ = auVar53._12_4_ * fVar214;
  auVar55 = vfmadd231ps_fma(auVar181,(undefined1  [16])aVar5,auVar55);
  auVar44 = vfmadd231ps_fma(auVar55,(undefined1  [16])aVar4,auVar196);
  auVar53 = vsubps_avx512vl(_local_208,(undefined1  [16])aVar3);
  uVar98 = auVar53._0_4_;
  auVar203._4_4_ = uVar98;
  auVar203._0_4_ = uVar98;
  auVar203._8_4_ = uVar98;
  auVar203._12_4_ = uVar98;
  auVar55 = vshufps_avx(auVar53,auVar53,0x55);
  auVar53 = vshufps_avx(auVar53,auVar53,0xaa);
  auVar197._0_4_ = auVar53._0_4_ * fVar218;
  auVar197._4_4_ = auVar53._4_4_ * fVar202;
  auVar197._8_4_ = auVar53._8_4_ * fVar213;
  auVar197._12_4_ = auVar53._12_4_ * fVar214;
  auVar55 = vfmadd231ps_fma(auVar197,(undefined1  [16])aVar5,auVar55);
  auVar45 = vfmadd231ps_fma(auVar55,(undefined1  [16])aVar4,auVar203);
  auVar53 = vsubps_avx(_local_218,(undefined1  [16])aVar3);
  uVar98 = auVar53._0_4_;
  auVar204._4_4_ = uVar98;
  auVar204._0_4_ = uVar98;
  auVar204._8_4_ = uVar98;
  auVar204._12_4_ = uVar98;
  auVar55 = vshufps_avx(auVar53,auVar53,0x55);
  auVar53 = vshufps_avx(auVar53,auVar53,0xaa);
  auVar129._0_4_ = fVar218 * auVar53._0_4_;
  auVar129._4_4_ = fVar202 * auVar53._4_4_;
  auVar129._8_4_ = fVar213 * auVar53._8_4_;
  auVar129._12_4_ = fVar214 * auVar53._12_4_;
  auVar55 = vfmadd231ps_fma(auVar129,(undefined1  [16])aVar5,auVar55);
  auVar46 = vfmadd231ps_fma(auVar55,(undefined1  [16])aVar4,auVar204);
  local_308 = vmovlhps_avx(auVar54,auVar47);
  local_318 = vmovlhps_avx(auVar61,auVar44);
  local_268 = vmovlhps_avx512f(auVar62,auVar45);
  _local_f8 = vmovlhps_avx512f(auVar63,auVar46);
  auVar53 = vminps_avx(local_308,local_318);
  auVar55 = vmaxps_avx(local_308,local_318);
  auVar57 = vminps_avx512vl(local_268,_local_f8);
  auVar53 = vminps_avx(auVar53,auVar57);
  auVar57 = vmaxps_avx512vl(local_268,_local_f8);
  auVar55 = vmaxps_avx(auVar55,auVar57);
  auVar57 = vshufpd_avx(auVar53,auVar53,3);
  auVar58 = vshufpd_avx(auVar55,auVar55,3);
  auVar53 = vminps_avx(auVar53,auVar57);
  auVar55 = vmaxps_avx(auVar55,auVar58);
  auVar53 = vandps_avx512vl(auVar53,auVar249._0_16_);
  auVar55 = vandps_avx512vl(auVar55,auVar249._0_16_);
  auVar55 = vmaxps_avx(auVar53,auVar55);
  auVar53 = vmovshdup_avx(auVar55);
  auVar55 = vmaxss_avx(auVar53,auVar55);
  lVar31 = uVar32 + 0xf;
  fVar218 = auVar55._0_4_ * 9.536743e-07;
  local_278._8_8_ = auVar54._0_8_;
  local_278._0_8_ = auVar54._0_8_;
  local_288._8_8_ = auVar61._0_8_;
  local_288._0_8_ = auVar61._0_8_;
  local_298 = vmovddup_avx512vl(auVar62);
  local_2a8 = vmovddup_avx512vl(auVar63);
  register0x00001348 = auVar47._0_8_;
  local_2b8 = auVar47._0_8_;
  register0x00001388 = auVar44._0_8_;
  local_2c8 = auVar44._0_8_;
  register0x00001408 = auVar45._0_8_;
  local_2d8 = auVar45._0_8_;
  register0x00001448 = auVar46._0_8_;
  local_2e8 = auVar46._0_8_;
  local_108 = ZEXT416((uint)fVar218);
  auVar106._4_4_ = fVar218;
  auVar106._0_4_ = fVar218;
  auVar106._8_4_ = fVar218;
  auVar106._12_4_ = fVar218;
  local_78._16_4_ = fVar218;
  local_78._0_16_ = auVar106;
  local_78._20_4_ = fVar218;
  local_78._24_4_ = fVar218;
  local_78._28_4_ = fVar218;
  auVar16._8_4_ = 0x80000000;
  auVar16._0_8_ = 0x8000000080000000;
  auVar16._12_4_ = 0x80000000;
  auVar55 = vxorps_avx512vl(auVar106,auVar16);
  local_98 = auVar55._0_4_;
  uStack_94 = local_98;
  uStack_90 = local_98;
  uStack_8c = local_98;
  uStack_88 = local_98;
  uStack_84 = local_98;
  uStack_80 = local_98;
  uStack_7c = local_98;
  local_c8 = vsubps_avx(local_318,local_308);
  local_d8 = vsubps_avx512vl(local_268,local_318);
  local_e8 = vsubps_avx512vl(_local_f8,local_268);
  local_118 = vsubps_avx512vl(_local_1e8,local_1a8);
  local_128 = vsubps_avx512vl(_local_1f8,local_1b8);
  local_138 = vsubps_avx512vl(_local_208,local_1c8);
  _local_148 = vsubps_avx(_local_218,local_1d8);
  uVar25 = 0;
  auVar55 = ZEXT816(0x3f80000000000000);
  auVar39 = auVar55;
LAB_018f11f4:
  auVar53 = vshufps_avx(auVar39,auVar39,0x50);
  auVar234._8_4_ = 0x3f800000;
  auVar234._0_8_ = 0x3f8000003f800000;
  auVar234._12_4_ = 0x3f800000;
  auVar237._16_4_ = 0x3f800000;
  auVar237._0_16_ = auVar234;
  auVar237._20_4_ = 0x3f800000;
  auVar237._24_4_ = 0x3f800000;
  auVar237._28_4_ = 0x3f800000;
  auVar57 = vsubps_avx(auVar234,auVar53);
  fVar218 = auVar53._0_4_;
  auVar130._0_4_ = local_2b8._0_4_ * fVar218;
  fVar202 = auVar53._4_4_;
  auVar130._4_4_ = local_2b8._4_4_ * fVar202;
  fVar213 = auVar53._8_4_;
  auVar130._8_4_ = local_2b8._8_4_ * fVar213;
  fVar214 = auVar53._12_4_;
  auVar130._12_4_ = local_2b8._12_4_ * fVar214;
  auVar138._0_4_ = local_2c8._0_4_ * fVar218;
  auVar138._4_4_ = local_2c8._4_4_ * fVar202;
  auVar138._8_4_ = local_2c8._8_4_ * fVar213;
  auVar138._12_4_ = local_2c8._12_4_ * fVar214;
  auVar153._0_4_ = local_2d8._0_4_ * fVar218;
  auVar153._4_4_ = local_2d8._4_4_ * fVar202;
  auVar153._8_4_ = local_2d8._8_4_ * fVar213;
  auVar153._12_4_ = local_2d8._12_4_ * fVar214;
  auVar117._0_4_ = local_2e8._0_4_ * fVar218;
  auVar117._4_4_ = local_2e8._4_4_ * fVar202;
  auVar117._8_4_ = local_2e8._8_4_ * fVar213;
  auVar117._12_4_ = local_2e8._12_4_ * fVar214;
  auVar58 = vfmadd231ps_fma(auVar130,auVar57,local_278);
  auVar54 = vfmadd231ps_fma(auVar138,auVar57,local_288);
  auVar61 = vfmadd231ps_avx512vl(auVar153,auVar57,local_298);
  auVar57 = vfmadd231ps_avx512vl(auVar117,local_2a8,auVar57);
  auVar53 = vmovshdup_avx(auVar55);
  fVar202 = auVar55._0_4_;
  fVar218 = (auVar53._0_4_ - fVar202) * 0.04761905;
  auVar145._4_4_ = fVar202;
  auVar145._0_4_ = fVar202;
  auVar145._8_4_ = fVar202;
  auVar145._12_4_ = fVar202;
  auVar145._16_4_ = fVar202;
  auVar145._20_4_ = fVar202;
  auVar145._24_4_ = fVar202;
  auVar145._28_4_ = fVar202;
  auVar74._0_8_ = auVar53._0_8_;
  auVar74._8_8_ = auVar74._0_8_;
  auVar74._16_8_ = auVar74._0_8_;
  auVar74._24_8_ = auVar74._0_8_;
  auVar83 = vsubps_avx(auVar74,auVar145);
  uVar98 = auVar58._0_4_;
  auVar127._4_4_ = uVar98;
  auVar127._0_4_ = uVar98;
  auVar127._8_4_ = uVar98;
  auVar127._12_4_ = uVar98;
  auVar127._16_4_ = uVar98;
  auVar127._20_4_ = uVar98;
  auVar127._24_4_ = uVar98;
  auVar127._28_4_ = uVar98;
  auVar75._8_4_ = 1;
  auVar75._0_8_ = 0x100000001;
  auVar75._12_4_ = 1;
  auVar75._16_4_ = 1;
  auVar75._20_4_ = 1;
  auVar75._24_4_ = 1;
  auVar75._28_4_ = 1;
  auVar82 = ZEXT1632(auVar58);
  auVar79 = vpermps_avx2(auVar75,auVar82);
  auVar64 = vbroadcastss_avx512vl(auVar54);
  auVar80 = ZEXT1632(auVar54);
  auVar65 = vpermps_avx512vl(auVar75,auVar80);
  auVar66 = vbroadcastss_avx512vl(auVar61);
  auVar81 = ZEXT1632(auVar61);
  auVar67 = vpermps_avx512vl(auVar75,auVar81);
  auVar68 = vbroadcastss_avx512vl(auVar57);
  auVar78 = ZEXT1632(auVar57);
  auVar69 = vpermps_avx512vl(auVar75,auVar78);
  auVar200._4_4_ = fVar218;
  auVar200._0_4_ = fVar218;
  auVar200._8_4_ = fVar218;
  auVar200._12_4_ = fVar218;
  auVar200._16_4_ = fVar218;
  auVar200._20_4_ = fVar218;
  auVar200._24_4_ = fVar218;
  auVar200._28_4_ = fVar218;
  auVar76._8_4_ = 2;
  auVar76._0_8_ = 0x200000002;
  auVar76._12_4_ = 2;
  auVar76._16_4_ = 2;
  auVar76._20_4_ = 2;
  auVar76._24_4_ = 2;
  auVar76._28_4_ = 2;
  auVar70 = vpermps_avx512vl(auVar76,auVar82);
  auVar71 = vbroadcastss_avx512vl(ZEXT416(3));
  auVar72 = vpermps_avx512vl(auVar71,auVar82);
  auVar73 = vpermps_avx512vl(auVar76,auVar80);
  auVar74 = vpermps_avx512vl(auVar71,auVar80);
  auVar82 = vpermps_avx2(auVar76,auVar81);
  auVar75 = vpermps_avx512vl(auVar71,auVar81);
  auVar76 = vpermps_avx512vl(auVar76,auVar78);
  auVar77 = vpermps_avx512vl(auVar71,auVar78);
  auVar53 = vfmadd132ps_fma(auVar83,auVar145,_DAT_01f7b040);
  auVar83 = vsubps_avx(auVar237,ZEXT1632(auVar53));
  auVar71 = vmulps_avx512vl(auVar64,ZEXT1632(auVar53));
  auVar80 = ZEXT1632(auVar53);
  auVar78 = vmulps_avx512vl(auVar65,auVar80);
  auVar57 = vfmadd231ps_fma(auVar71,auVar83,auVar127);
  auVar58 = vfmadd231ps_fma(auVar78,auVar83,auVar79);
  auVar71 = vmulps_avx512vl(auVar66,auVar80);
  auVar78 = vmulps_avx512vl(auVar67,auVar80);
  auVar64 = vfmadd231ps_avx512vl(auVar71,auVar83,auVar64);
  auVar65 = vfmadd231ps_avx512vl(auVar78,auVar83,auVar65);
  auVar71 = vmulps_avx512vl(auVar68,auVar80);
  auVar127 = ZEXT1632(auVar53);
  auVar69 = vmulps_avx512vl(auVar69,auVar127);
  auVar66 = vfmadd231ps_avx512vl(auVar71,auVar83,auVar66);
  auVar67 = vfmadd231ps_avx512vl(auVar69,auVar83,auVar67);
  fVar213 = auVar53._0_4_;
  fVar214 = auVar53._4_4_;
  auVar71._4_4_ = fVar214 * auVar64._4_4_;
  auVar71._0_4_ = fVar213 * auVar64._0_4_;
  fVar215 = auVar53._8_4_;
  auVar71._8_4_ = fVar215 * auVar64._8_4_;
  fVar216 = auVar53._12_4_;
  auVar71._12_4_ = fVar216 * auVar64._12_4_;
  auVar71._16_4_ = auVar64._16_4_ * 0.0;
  auVar71._20_4_ = auVar64._20_4_ * 0.0;
  auVar71._24_4_ = auVar64._24_4_ * 0.0;
  auVar71._28_4_ = fVar202;
  auVar78._4_4_ = fVar214 * auVar65._4_4_;
  auVar78._0_4_ = fVar213 * auVar65._0_4_;
  auVar78._8_4_ = fVar215 * auVar65._8_4_;
  auVar78._12_4_ = fVar216 * auVar65._12_4_;
  auVar78._16_4_ = auVar65._16_4_ * 0.0;
  auVar78._20_4_ = auVar65._20_4_ * 0.0;
  auVar78._24_4_ = auVar65._24_4_ * 0.0;
  auVar78._28_4_ = auVar79._28_4_;
  auVar57 = vfmadd231ps_fma(auVar71,auVar83,ZEXT1632(auVar57));
  auVar58 = vfmadd231ps_fma(auVar78,auVar83,ZEXT1632(auVar58));
  auVar84._0_4_ = fVar213 * auVar66._0_4_;
  auVar84._4_4_ = fVar214 * auVar66._4_4_;
  auVar84._8_4_ = fVar215 * auVar66._8_4_;
  auVar84._12_4_ = fVar216 * auVar66._12_4_;
  auVar84._16_4_ = auVar66._16_4_ * 0.0;
  auVar84._20_4_ = auVar66._20_4_ * 0.0;
  auVar84._24_4_ = auVar66._24_4_ * 0.0;
  auVar84._28_4_ = 0;
  auVar80._4_4_ = fVar214 * auVar67._4_4_;
  auVar80._0_4_ = fVar213 * auVar67._0_4_;
  auVar80._8_4_ = fVar215 * auVar67._8_4_;
  auVar80._12_4_ = fVar216 * auVar67._12_4_;
  auVar80._16_4_ = auVar67._16_4_ * 0.0;
  auVar80._20_4_ = auVar67._20_4_ * 0.0;
  auVar80._24_4_ = auVar67._24_4_ * 0.0;
  auVar80._28_4_ = auVar66._28_4_;
  auVar54 = vfmadd231ps_fma(auVar84,auVar83,auVar64);
  auVar61 = vfmadd231ps_fma(auVar80,auVar83,auVar65);
  auVar81._28_4_ = auVar65._28_4_;
  auVar81._0_28_ =
       ZEXT1628(CONCAT412(fVar216 * auVar61._12_4_,
                          CONCAT48(fVar215 * auVar61._8_4_,
                                   CONCAT44(fVar214 * auVar61._4_4_,fVar213 * auVar61._0_4_))));
  auVar62 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar216 * auVar54._12_4_,
                                               CONCAT48(fVar215 * auVar54._8_4_,
                                                        CONCAT44(fVar214 * auVar54._4_4_,
                                                                 fVar213 * auVar54._0_4_)))),auVar83
                            ,ZEXT1632(auVar57));
  auVar63 = vfmadd231ps_fma(auVar81,auVar83,ZEXT1632(auVar58));
  auVar79 = vsubps_avx(ZEXT1632(auVar54),ZEXT1632(auVar57));
  auVar64 = vsubps_avx(ZEXT1632(auVar61),ZEXT1632(auVar58));
  auVar65 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar79 = vmulps_avx512vl(auVar79,auVar65);
  auVar64 = vmulps_avx512vl(auVar64,auVar65);
  auVar190._0_4_ = fVar218 * auVar79._0_4_;
  auVar190._4_4_ = fVar218 * auVar79._4_4_;
  auVar190._8_4_ = fVar218 * auVar79._8_4_;
  auVar190._12_4_ = fVar218 * auVar79._12_4_;
  auVar190._16_4_ = fVar218 * auVar79._16_4_;
  auVar190._20_4_ = fVar218 * auVar79._20_4_;
  auVar190._24_4_ = fVar218 * auVar79._24_4_;
  auVar190._28_4_ = 0;
  auVar79 = vmulps_avx512vl(auVar200,auVar64);
  auVar58 = vxorps_avx512vl(auVar68._0_16_,auVar68._0_16_);
  auVar64 = vpermt2ps_avx512vl(ZEXT1632(auVar62),_DAT_01fb9fc0,ZEXT1632(auVar58));
  auVar66 = vpermt2ps_avx512vl(ZEXT1632(auVar63),_DAT_01fb9fc0,ZEXT1632(auVar58));
  auVar122._0_4_ = auVar190._0_4_ + auVar62._0_4_;
  auVar122._4_4_ = auVar190._4_4_ + auVar62._4_4_;
  auVar122._8_4_ = auVar190._8_4_ + auVar62._8_4_;
  auVar122._12_4_ = auVar190._12_4_ + auVar62._12_4_;
  auVar122._16_4_ = auVar190._16_4_ + 0.0;
  auVar122._20_4_ = auVar190._20_4_ + 0.0;
  auVar122._24_4_ = auVar190._24_4_ + 0.0;
  auVar122._28_4_ = 0;
  auVar84 = ZEXT1632(auVar58);
  auVar67 = vpermt2ps_avx512vl(auVar190,_DAT_01fb9fc0,auVar84);
  auVar68 = vaddps_avx512vl(ZEXT1632(auVar63),auVar79);
  auVar69 = vpermt2ps_avx512vl(auVar79,_DAT_01fb9fc0,auVar84);
  auVar79 = vsubps_avx(auVar64,auVar67);
  auVar67 = vsubps_avx512vl(auVar66,auVar69);
  auVar69 = vmulps_avx512vl(auVar73,auVar127);
  auVar71 = vmulps_avx512vl(auVar74,auVar127);
  auVar69 = vfmadd231ps_avx512vl(auVar69,auVar83,auVar70);
  auVar71 = vfmadd231ps_avx512vl(auVar71,auVar83,auVar72);
  auVar78 = vmulps_avx512vl(auVar82,auVar127);
  auVar80 = vmulps_avx512vl(auVar75,auVar127);
  auVar78 = vfmadd231ps_avx512vl(auVar78,auVar83,auVar73);
  auVar80 = vfmadd231ps_avx512vl(auVar80,auVar83,auVar74);
  auVar81 = vmulps_avx512vl(auVar76,auVar127);
  auVar70 = vmulps_avx512vl(auVar77,auVar127);
  auVar57 = vfmadd231ps_fma(auVar81,auVar83,auVar82);
  auVar82 = vfmadd231ps_avx512vl(auVar70,auVar83,auVar75);
  auVar81 = vmulps_avx512vl(auVar127,auVar78);
  auVar72 = ZEXT1632(auVar53);
  auVar70 = vmulps_avx512vl(auVar72,auVar80);
  auVar69 = vfmadd231ps_avx512vl(auVar81,auVar83,auVar69);
  auVar71 = vfmadd231ps_avx512vl(auVar70,auVar83,auVar71);
  auVar82 = vmulps_avx512vl(auVar72,auVar82);
  auVar78 = vfmadd231ps_avx512vl
                      (ZEXT1632(CONCAT412(fVar216 * auVar57._12_4_,
                                          CONCAT48(fVar215 * auVar57._8_4_,
                                                   CONCAT44(fVar214 * auVar57._4_4_,
                                                            fVar213 * auVar57._0_4_)))),auVar83,
                       auVar78);
  auVar82 = vfmadd231ps_avx512vl(auVar82,auVar83,auVar80);
  auVar70._4_4_ = fVar214 * auVar78._4_4_;
  auVar70._0_4_ = fVar213 * auVar78._0_4_;
  auVar70._8_4_ = fVar215 * auVar78._8_4_;
  auVar70._12_4_ = fVar216 * auVar78._12_4_;
  auVar70._16_4_ = auVar78._16_4_ * 0.0;
  auVar70._20_4_ = auVar78._20_4_ * 0.0;
  auVar70._24_4_ = auVar78._24_4_ * 0.0;
  auVar70._28_4_ = auVar75._28_4_;
  auVar80 = vmulps_avx512vl(auVar72,auVar82);
  auVar81 = vfmadd231ps_avx512vl(auVar70,auVar83,auVar69);
  auVar80 = vfmadd231ps_avx512vl(auVar80,auVar71,auVar83);
  auVar83 = vsubps_avx512vl(auVar78,auVar69);
  auVar82 = vsubps_avx512vl(auVar82,auVar71);
  auVar83 = vmulps_avx512vl(auVar83,auVar65);
  auVar82 = vmulps_avx512vl(auVar82,auVar65);
  fVar202 = fVar218 * auVar83._0_4_;
  fVar213 = fVar218 * auVar83._4_4_;
  auVar72._4_4_ = fVar213;
  auVar72._0_4_ = fVar202;
  fVar214 = fVar218 * auVar83._8_4_;
  auVar72._8_4_ = fVar214;
  fVar215 = fVar218 * auVar83._12_4_;
  auVar72._12_4_ = fVar215;
  fVar216 = fVar218 * auVar83._16_4_;
  auVar72._16_4_ = fVar216;
  fVar217 = fVar218 * auVar83._20_4_;
  auVar72._20_4_ = fVar217;
  fVar218 = fVar218 * auVar83._24_4_;
  auVar72._24_4_ = fVar218;
  auVar72._28_4_ = auVar83._28_4_;
  auVar82 = vmulps_avx512vl(auVar200,auVar82);
  auVar65 = vpermt2ps_avx512vl(auVar81,_DAT_01fb9fc0,auVar84);
  auVar69 = vpermt2ps_avx512vl(auVar80,_DAT_01fb9fc0,auVar84);
  auVar201._0_4_ = auVar81._0_4_ + fVar202;
  auVar201._4_4_ = auVar81._4_4_ + fVar213;
  auVar201._8_4_ = auVar81._8_4_ + fVar214;
  auVar201._12_4_ = auVar81._12_4_ + fVar215;
  auVar201._16_4_ = auVar81._16_4_ + fVar216;
  auVar201._20_4_ = auVar81._20_4_ + fVar217;
  auVar201._24_4_ = auVar81._24_4_ + fVar218;
  auVar201._28_4_ = auVar81._28_4_ + auVar83._28_4_;
  auVar83 = vpermt2ps_avx512vl(auVar72,_DAT_01fb9fc0,ZEXT1632(auVar58));
  auVar71 = vaddps_avx512vl(auVar80,auVar82);
  auVar82 = vpermt2ps_avx512vl(auVar82,_DAT_01fb9fc0,ZEXT1632(auVar58));
  auVar83 = vsubps_avx(auVar65,auVar83);
  auVar82 = vsubps_avx512vl(auVar69,auVar82);
  auVar127 = ZEXT1632(auVar62);
  auVar78 = vsubps_avx512vl(auVar81,auVar127);
  auVar145 = ZEXT1632(auVar63);
  auVar70 = vsubps_avx512vl(auVar80,auVar145);
  auVar72 = vsubps_avx512vl(auVar65,auVar64);
  auVar78 = vaddps_avx512vl(auVar78,auVar72);
  auVar72 = vsubps_avx512vl(auVar69,auVar66);
  auVar70 = vaddps_avx512vl(auVar70,auVar72);
  auVar72 = vmulps_avx512vl(auVar145,auVar78);
  auVar72 = vfnmadd231ps_avx512vl(auVar72,auVar127,auVar70);
  auVar73 = vmulps_avx512vl(auVar68,auVar78);
  auVar73 = vfnmadd231ps_avx512vl(auVar73,auVar122,auVar70);
  auVar74 = vmulps_avx512vl(auVar67,auVar78);
  auVar74 = vfnmadd231ps_avx512vl(auVar74,auVar79,auVar70);
  auVar75 = vmulps_avx512vl(auVar66,auVar78);
  auVar75 = vfnmadd231ps_avx512vl(auVar75,auVar64,auVar70);
  auVar76 = vmulps_avx512vl(auVar80,auVar78);
  auVar76 = vfnmadd231ps_avx512vl(auVar76,auVar81,auVar70);
  auVar77 = vmulps_avx512vl(auVar71,auVar78);
  auVar77 = vfnmadd231ps_avx512vl(auVar77,auVar201,auVar70);
  auVar84 = vmulps_avx512vl(auVar82,auVar78);
  auVar84 = vfnmadd231ps_avx512vl(auVar84,auVar83,auVar70);
  auVar78 = vmulps_avx512vl(auVar69,auVar78);
  auVar78 = vfnmadd231ps_avx512vl(auVar78,auVar65,auVar70);
  auVar70 = vminps_avx512vl(auVar72,auVar73);
  auVar72 = vmaxps_avx512vl(auVar72,auVar73);
  auVar73 = vminps_avx512vl(auVar74,auVar75);
  auVar70 = vminps_avx512vl(auVar70,auVar73);
  auVar73 = vmaxps_avx512vl(auVar74,auVar75);
  auVar72 = vmaxps_avx512vl(auVar72,auVar73);
  auVar73 = vminps_avx512vl(auVar76,auVar77);
  auVar74 = vmaxps_avx512vl(auVar76,auVar77);
  auVar75 = vminps_avx512vl(auVar84,auVar78);
  auVar73 = vminps_avx512vl(auVar73,auVar75);
  auVar70 = vminps_avx512vl(auVar70,auVar73);
  auVar78 = vmaxps_avx512vl(auVar84,auVar78);
  auVar78 = vmaxps_avx512vl(auVar74,auVar78);
  auVar78 = vmaxps_avx512vl(auVar72,auVar78);
  uVar14 = vcmpps_avx512vl(auVar70,local_78,2);
  auVar73._4_4_ = uStack_94;
  auVar73._0_4_ = local_98;
  auVar73._8_4_ = uStack_90;
  auVar73._12_4_ = uStack_8c;
  auVar73._16_4_ = uStack_88;
  auVar73._20_4_ = uStack_84;
  auVar73._24_4_ = uStack_80;
  auVar73._28_4_ = uStack_7c;
  uVar15 = vcmpps_avx512vl(auVar78,auVar73,5);
  bVar23 = (byte)uVar14 & (byte)uVar15 & 0x7f;
  if (bVar23 != 0) {
    auVar78 = vsubps_avx512vl(auVar64,auVar127);
    auVar70 = vsubps_avx512vl(auVar66,auVar145);
    auVar72 = vsubps_avx512vl(auVar65,auVar81);
    auVar78 = vaddps_avx512vl(auVar78,auVar72);
    auVar72 = vsubps_avx512vl(auVar69,auVar80);
    auVar70 = vaddps_avx512vl(auVar70,auVar72);
    auVar72 = vmulps_avx512vl(auVar145,auVar78);
    auVar72 = vfnmadd231ps_avx512vl(auVar72,auVar70,auVar127);
    auVar68 = vmulps_avx512vl(auVar68,auVar78);
    auVar68 = vfnmadd213ps_avx512vl(auVar122,auVar70,auVar68);
    auVar67 = vmulps_avx512vl(auVar67,auVar78);
    auVar67 = vfnmadd213ps_avx512vl(auVar79,auVar70,auVar67);
    auVar79 = vmulps_avx512vl(auVar66,auVar78);
    auVar66 = vfnmadd231ps_avx512vl(auVar79,auVar70,auVar64);
    auVar79 = vmulps_avx512vl(auVar80,auVar78);
    auVar80 = vfnmadd231ps_avx512vl(auVar79,auVar70,auVar81);
    auVar79 = vmulps_avx512vl(auVar71,auVar78);
    auVar71 = vfnmadd213ps_avx512vl(auVar201,auVar70,auVar79);
    auVar79 = vmulps_avx512vl(auVar82,auVar78);
    auVar81 = vfnmadd213ps_avx512vl(auVar83,auVar70,auVar79);
    auVar83 = vmulps_avx512vl(auVar69,auVar78);
    auVar69 = vfnmadd231ps_avx512vl(auVar83,auVar65,auVar70);
    auVar79 = vminps_avx(auVar72,auVar68);
    auVar83 = vmaxps_avx(auVar72,auVar68);
    auVar64 = vminps_avx(auVar67,auVar66);
    auVar64 = vminps_avx(auVar79,auVar64);
    auVar79 = vmaxps_avx(auVar67,auVar66);
    auVar83 = vmaxps_avx(auVar83,auVar79);
    auVar82 = vminps_avx(auVar80,auVar71);
    auVar79 = vmaxps_avx(auVar80,auVar71);
    auVar65 = vminps_avx(auVar81,auVar69);
    auVar82 = vminps_avx(auVar82,auVar65);
    auVar82 = vminps_avx(auVar64,auVar82);
    auVar64 = vmaxps_avx(auVar81,auVar69);
    auVar79 = vmaxps_avx(auVar79,auVar64);
    auVar83 = vmaxps_avx(auVar83,auVar79);
    uVar14 = vcmpps_avx512vl(auVar83,auVar73,5);
    uVar15 = vcmpps_avx512vl(auVar82,local_78,2);
    bVar23 = bVar23 & (byte)uVar14 & (byte)uVar15;
    if (bVar23 != 0) {
      auStack_198[uVar25] = (uint)bVar23;
      uVar14 = vmovlps_avx(auVar55);
      (&uStack_b8)[uVar25] = uVar14;
      uVar2 = vmovlps_avx(auVar39);
      auStack_58[uVar25] = uVar2;
      uVar25 = (ulong)((int)uVar25 + 1);
    }
  }
  auVar55 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar248 = ZEXT1664(auVar55);
  auVar83 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar245 = ZEXT3264(auVar83);
  auVar55 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
  auVar246 = ZEXT1664(auVar55);
  auVar247 = ZEXT3264(_DAT_01fb9fe0);
  auVar83 = _DAT_01fb9fe0;
LAB_018f16f8:
  do {
    do {
      do {
        auVar53 = auVar250._0_16_;
        auVar57 = auVar252._0_16_;
        if ((int)uVar25 == 0) {
          fVar218 = (ray->super_RayK<1>).tfar;
          auVar22._4_4_ = fVar218;
          auVar22._0_4_ = fVar218;
          auVar22._8_4_ = fVar218;
          auVar22._12_4_ = fVar218;
          uVar14 = vcmpps_avx512vl(local_158,auVar22,2);
          uVar32 = (ulong)((uint)uVar32 & (uint)lVar31 & (uint)uVar14);
          goto LAB_018f0749;
        }
        uVar24 = (int)uVar25 - 1;
        uVar26 = (ulong)uVar24;
        uVar7 = auStack_198[uVar26];
        auVar39._8_8_ = 0;
        auVar39._0_8_ = auStack_58[uVar26];
        uVar2 = 0;
        for (uVar30 = (ulong)uVar7; (uVar30 & 1) == 0; uVar30 = uVar30 >> 1 | 0x8000000000000000) {
          uVar2 = uVar2 + 1;
        }
        uVar28 = uVar7 - 1 & uVar7;
        bVar35 = uVar28 == 0;
        auStack_198[uVar26] = uVar28;
        if (bVar35) {
          uVar25 = (ulong)uVar24;
        }
        auVar107._8_8_ = 0;
        auVar107._0_8_ = uVar2;
        auVar55 = vpunpcklqdq_avx(auVar107,ZEXT416((int)uVar2 + 1));
        auVar55 = vcvtqq2ps_avx512vl(auVar55);
        auVar55 = vmulps_avx512vl(auVar55,auVar246._0_16_);
        uVar98 = *(undefined4 *)((long)&uStack_b8 + uVar26 * 8 + 4);
        auVar17._4_4_ = uVar98;
        auVar17._0_4_ = uVar98;
        auVar17._8_4_ = uVar98;
        auVar17._12_4_ = uVar98;
        auVar58 = vmulps_avx512vl(auVar55,auVar17);
        auVar55 = vsubps_avx512vl(auVar53,auVar55);
        uVar98 = *(undefined4 *)(&uStack_b8 + uVar26);
        auVar18._4_4_ = uVar98;
        auVar18._0_4_ = uVar98;
        auVar18._8_4_ = uVar98;
        auVar18._12_4_ = uVar98;
        auVar55 = vfmadd231ps_avx512vl(auVar58,auVar55,auVar18);
        auVar58 = vmovshdup_avx(auVar55);
        fVar218 = auVar58._0_4_ - auVar55._0_4_;
        vucomiss_avx512f(ZEXT416((uint)fVar218));
        if (uVar7 == 0 || bVar35) goto LAB_018f11f4;
        auVar58 = vshufps_avx(auVar39,auVar39,0x50);
        vucomiss_avx512f(ZEXT416((uint)fVar218));
        auVar62 = vsubps_avx512vl(auVar53,auVar58);
        fVar202 = auVar58._0_4_;
        auVar139._0_4_ = fVar202 * (float)local_2b8._0_4_;
        fVar213 = auVar58._4_4_;
        auVar139._4_4_ = fVar213 * (float)local_2b8._4_4_;
        fVar214 = auVar58._8_4_;
        auVar139._8_4_ = fVar214 * fStack_2b0;
        fVar215 = auVar58._12_4_;
        auVar139._12_4_ = fVar215 * fStack_2ac;
        auVar154._0_4_ = fVar202 * (float)local_2c8._0_4_;
        auVar154._4_4_ = fVar213 * (float)local_2c8._4_4_;
        auVar154._8_4_ = fVar214 * fStack_2c0;
        auVar154._12_4_ = fVar215 * fStack_2bc;
        auVar162._0_4_ = fVar202 * (float)local_2d8._0_4_;
        auVar162._4_4_ = fVar213 * (float)local_2d8._4_4_;
        auVar162._8_4_ = fVar214 * fStack_2d0;
        auVar162._12_4_ = fVar215 * fStack_2cc;
        auVar123._0_4_ = fVar202 * (float)local_2e8._0_4_;
        auVar123._4_4_ = fVar213 * (float)local_2e8._4_4_;
        auVar123._8_4_ = fVar214 * fStack_2e0;
        auVar123._12_4_ = fVar215 * fStack_2dc;
        auVar58 = vfmadd231ps_fma(auVar139,auVar62,local_278);
        auVar54 = vfmadd231ps_fma(auVar154,auVar62,local_288);
        auVar61 = vfmadd231ps_fma(auVar162,auVar62,local_298);
        auVar62 = vfmadd231ps_fma(auVar123,auVar62,local_2a8);
        auVar77._16_16_ = auVar58;
        auVar77._0_16_ = auVar58;
        auVar146._16_16_ = auVar54;
        auVar146._0_16_ = auVar54;
        auVar158._16_16_ = auVar61;
        auVar158._0_16_ = auVar61;
        auVar79 = vpermps_avx512vl(auVar247._0_32_,ZEXT1632(auVar55));
        auVar83 = vsubps_avx(auVar146,auVar77);
        auVar54 = vfmadd213ps_fma(auVar83,auVar79,auVar77);
        auVar83 = vsubps_avx(auVar158,auVar146);
        auVar63 = vfmadd213ps_fma(auVar83,auVar79,auVar146);
        auVar58 = vsubps_avx(auVar62,auVar61);
        auVar147._16_16_ = auVar58;
        auVar147._0_16_ = auVar58;
        auVar58 = vfmadd213ps_fma(auVar147,auVar79,auVar158);
        auVar83 = vsubps_avx(ZEXT1632(auVar63),ZEXT1632(auVar54));
        auVar54 = vfmadd213ps_fma(auVar83,auVar79,ZEXT1632(auVar54));
        auVar83 = vsubps_avx(ZEXT1632(auVar58),ZEXT1632(auVar63));
        auVar58 = vfmadd213ps_fma(auVar83,auVar79,ZEXT1632(auVar63));
        auVar83 = vsubps_avx(ZEXT1632(auVar58),ZEXT1632(auVar54));
        auVar50 = vfmadd231ps_fma(ZEXT1632(auVar54),auVar83,auVar79);
        auVar83 = vmulps_avx512vl(auVar83,auVar245._0_32_);
        auVar58 = vmulss_avx512f(ZEXT416((uint)fVar218),SUB6416(ZEXT464(0x3eaaaaab),0));
        fVar202 = auVar58._0_4_;
        auVar163._0_8_ =
             CONCAT44(auVar50._4_4_ + fVar202 * auVar83._4_4_,
                      auVar50._0_4_ + fVar202 * auVar83._0_4_);
        auVar163._8_4_ = auVar50._8_4_ + fVar202 * auVar83._8_4_;
        auVar163._12_4_ = auVar50._12_4_ + fVar202 * auVar83._12_4_;
        auVar140._0_4_ = fVar202 * auVar83._16_4_;
        auVar140._4_4_ = fVar202 * auVar83._20_4_;
        auVar140._8_4_ = fVar202 * auVar83._24_4_;
        auVar140._12_4_ = fVar202 * auVar83._28_4_;
        auVar46 = vsubps_avx((undefined1  [16])0x0,auVar140);
        auVar63 = vshufpd_avx(auVar50,auVar50,3);
        auVar47 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
        auVar58 = vsubps_avx(auVar63,auVar50);
        auVar54 = vsubps_avx(auVar47,(undefined1  [16])0x0);
        auVar182._0_4_ = auVar58._0_4_ + auVar54._0_4_;
        auVar182._4_4_ = auVar58._4_4_ + auVar54._4_4_;
        auVar182._8_4_ = auVar58._8_4_ + auVar54._8_4_;
        auVar182._12_4_ = auVar58._12_4_ + auVar54._12_4_;
        auVar58 = vshufps_avx(auVar50,auVar50,0xb1);
        auVar54 = vshufps_avx(auVar163,auVar163,0xb1);
        auVar61 = vshufps_avx(auVar46,auVar46,0xb1);
        auVar62 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
        auVar235._4_4_ = auVar182._0_4_;
        auVar235._0_4_ = auVar182._0_4_;
        auVar235._8_4_ = auVar182._0_4_;
        auVar235._12_4_ = auVar182._0_4_;
        auVar44 = vshufps_avx(auVar182,auVar182,0x55);
        fVar202 = auVar44._0_4_;
        auVar198._0_4_ = auVar58._0_4_ * fVar202;
        fVar213 = auVar44._4_4_;
        auVar198._4_4_ = auVar58._4_4_ * fVar213;
        fVar214 = auVar44._8_4_;
        auVar198._8_4_ = auVar58._8_4_ * fVar214;
        fVar215 = auVar44._12_4_;
        auVar198._12_4_ = auVar58._12_4_ * fVar215;
        auVar205._0_4_ = auVar54._0_4_ * fVar202;
        auVar205._4_4_ = auVar54._4_4_ * fVar213;
        auVar205._8_4_ = auVar54._8_4_ * fVar214;
        auVar205._12_4_ = auVar54._12_4_ * fVar215;
        auVar220._0_4_ = auVar61._0_4_ * fVar202;
        auVar220._4_4_ = auVar61._4_4_ * fVar213;
        auVar220._8_4_ = auVar61._8_4_ * fVar214;
        auVar220._12_4_ = auVar61._12_4_ * fVar215;
        auVar183._0_4_ = auVar62._0_4_ * fVar202;
        auVar183._4_4_ = auVar62._4_4_ * fVar213;
        auVar183._8_4_ = auVar62._8_4_ * fVar214;
        auVar183._12_4_ = auVar62._12_4_ * fVar215;
        auVar58 = vfmadd231ps_fma(auVar198,auVar235,auVar50);
        auVar54 = vfmadd231ps_fma(auVar205,auVar235,auVar163);
        auVar48 = vfmadd231ps_fma(auVar220,auVar235,auVar46);
        auVar49 = vfmadd231ps_fma(auVar183,(undefined1  [16])0x0,auVar235);
        auVar44 = vshufpd_avx(auVar58,auVar58,1);
        auVar45 = vshufpd_avx(auVar54,auVar54,1);
        auVar51 = vshufpd_avx512vl(auVar48,auVar48,1);
        auVar52 = vshufpd_avx512vl(auVar49,auVar49,1);
        auVar61 = vminss_avx(auVar58,auVar54);
        auVar58 = vmaxss_avx(auVar54,auVar58);
        auVar62 = vminss_avx(auVar48,auVar49);
        auVar54 = vmaxss_avx(auVar49,auVar48);
        auVar61 = vminss_avx(auVar61,auVar62);
        auVar58 = vmaxss_avx(auVar54,auVar58);
        auVar62 = vminss_avx(auVar44,auVar45);
        auVar54 = vmaxss_avx(auVar45,auVar44);
        auVar44 = vminss_avx512f(auVar51,auVar52);
        auVar45 = vmaxss_avx512f(auVar52,auVar51);
        auVar54 = vmaxss_avx(auVar45,auVar54);
        auVar83._0_16_ = vminss_avx512f(auVar62,auVar44);
        vucomiss_avx512f(auVar61);
        fVar213 = auVar54._0_4_;
        fVar202 = auVar58._0_4_;
        if (4 < (uint)uVar25) {
          bVar36 = fVar213 == -0.0001;
          bVar33 = NAN(fVar213);
          if (fVar213 <= -0.0001) goto LAB_018f191d;
          break;
        }
LAB_018f191d:
        auVar62 = vucomiss_avx512f(auVar83._0_16_);
        bVar36 = fVar213 <= -0.0001;
        bVar34 = -0.0001 < fVar202;
        bVar33 = bVar36;
        if (!bVar36) break;
        uVar14 = vcmpps_avx512vl(auVar61,auVar62,5);
        uVar15 = vcmpps_avx512vl(auVar83._0_16_,auVar62,5);
        bVar23 = (byte)uVar14 & (byte)uVar15 & 1;
        bVar36 = bVar34 && bVar23 == 0;
        bVar33 = bVar34 && bVar23 == 0;
      } while (!bVar34 || bVar23 != 0);
      vcmpss_avx512f(auVar61,auVar57,1);
      auVar45 = auVar251._0_16_;
      uVar14 = vcmpss_avx512f(auVar58,auVar57,1);
      bVar34 = (bool)((byte)uVar14 & 1);
      auVar86._16_16_ = auVar83._16_16_;
      auVar86._0_16_ = auVar45;
      iVar97 = auVar251._0_4_;
      auVar85._4_28_ = auVar86._4_28_;
      auVar85._0_4_ = (float)((uint)bVar34 * -0x40800000 + (uint)!bVar34 * iVar97);
      vucomiss_avx512f(auVar85._0_16_);
      bVar33 = (bool)(!bVar36 | bVar33);
      bVar34 = bVar33 == false;
      auVar88._16_16_ = auVar83._16_16_;
      auVar88._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
      auVar87._4_28_ = auVar88._4_28_;
      auVar87._0_4_ = (uint)bVar33 * auVar252._0_4_ + (uint)!bVar33 * 0x7f800000;
      auVar44 = auVar87._0_16_;
      auVar90._16_16_ = auVar83._16_16_;
      auVar90._0_16_ = SUB6416(ZEXT464(0xff800000),0);
      auVar89._4_28_ = auVar90._4_28_;
      auVar89._0_4_ = (uint)bVar33 * auVar252._0_4_ + (uint)!bVar33 * -0x800000;
      auVar62 = auVar89._0_16_;
      uVar14 = vcmpss_avx512f(auVar83._0_16_,auVar57,1);
      bVar36 = (bool)((byte)uVar14 & 1);
      auVar92._16_16_ = auVar83._16_16_;
      auVar92._0_16_ = auVar45;
      auVar91._4_28_ = auVar92._4_28_;
      auVar91._0_4_ = (float)((uint)bVar36 * -0x40800000 + (uint)!bVar36 * iVar97);
      vucomiss_avx512f(auVar91._0_16_);
      if ((bVar33) || (bVar34)) {
        auVar48 = vucomiss_avx512f(auVar61);
        if ((bVar33) || (bVar34)) {
          auVar21._8_4_ = 0x80000000;
          auVar21._0_8_ = 0x8000000080000000;
          auVar21._12_4_ = 0x80000000;
          auVar49 = vxorps_avx512vl(auVar61,auVar21);
          auVar61 = vsubss_avx512f(auVar48,auVar61);
          auVar61 = vdivss_avx512f(auVar49,auVar61);
          auVar48 = vsubss_avx512f(auVar45,auVar61);
          auVar61 = vfmadd213ss_avx512f(auVar48,auVar57,auVar61);
          auVar48 = auVar61;
        }
        else {
          auVar48 = vxorps_avx512vl(auVar48,auVar48);
          vucomiss_avx512f(auVar48);
          if ((bVar33) || (auVar61 = auVar45, bVar34)) {
            auVar61 = SUB6416(ZEXT464(0xff800000),0);
            auVar48 = ZEXT416(0x7f800000);
          }
        }
        auVar44 = vminss_avx512f(auVar44,auVar48);
        auVar62 = vmaxss_avx(auVar61,auVar62);
      }
      uVar14 = vcmpss_avx512f(auVar54,auVar57,1);
      bVar36 = (bool)((byte)uVar14 & 1);
      fVar214 = (float)((uint)bVar36 * -0x40800000 + (uint)!bVar36 * iVar97);
      if ((auVar85._0_4_ != fVar214) || (NAN(auVar85._0_4_) || NAN(fVar214))) {
        if ((fVar213 != fVar202) || (NAN(fVar213) || NAN(fVar202))) {
          auVar20._8_4_ = 0x80000000;
          auVar20._0_8_ = 0x8000000080000000;
          auVar20._12_4_ = 0x80000000;
          auVar58 = vxorps_avx512vl(auVar58,auVar20);
          auVar184._0_4_ = auVar58._0_4_ / (fVar213 - fVar202);
          auVar184._4_12_ = auVar58._4_12_;
          auVar58 = vsubss_avx512f(auVar45,auVar184);
          auVar58 = vfmadd213ss_avx512f(auVar58,auVar57,auVar184);
          auVar54 = auVar58;
        }
        else if ((fVar202 != 0.0) ||
                (auVar58 = auVar45, auVar54 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar202))) {
          auVar58 = SUB6416(ZEXT464(0xff800000),0);
          auVar54 = SUB6416(ZEXT464(0x7f800000),0);
        }
        auVar44 = vminss_avx(auVar44,auVar54);
        auVar62 = vmaxss_avx(auVar58,auVar62);
      }
      bVar36 = auVar91._0_4_ != fVar214;
      auVar58 = vminss_avx512f(auVar44,auVar45);
      auVar94._16_16_ = auVar83._16_16_;
      auVar94._0_16_ = auVar44;
      auVar93._4_28_ = auVar94._4_28_;
      auVar93._0_4_ = (uint)bVar36 * auVar58._0_4_ + (uint)!bVar36 * auVar44._0_4_;
      auVar58 = vmaxss_avx512f(auVar45,auVar62);
      auVar96._16_16_ = auVar83._16_16_;
      auVar96._0_16_ = auVar62;
      auVar95._4_28_ = auVar96._4_28_;
      auVar95._0_4_ = (uint)bVar36 * auVar58._0_4_ + (uint)!bVar36 * auVar62._0_4_;
      auVar58 = vmaxss_avx512f(auVar57,auVar93._0_16_);
      auVar83._0_16_ = vminss_avx512f(auVar95._0_16_,auVar45);
    } while (auVar83._0_4_ < auVar58._0_4_);
    auVar62 = vmaxss_avx512f(auVar57,ZEXT416((uint)(auVar58._0_4_ + -0.1)));
    auVar48 = vminss_avx512f(ZEXT416((uint)(auVar83._0_4_ + 0.1)),auVar45);
    auVar124._0_8_ = auVar50._0_8_;
    auVar124._8_8_ = auVar124._0_8_;
    auVar206._8_8_ = auVar163._0_8_;
    auVar206._0_8_ = auVar163._0_8_;
    auVar221._8_8_ = auVar46._0_8_;
    auVar221._0_8_ = auVar46._0_8_;
    auVar58 = vshufpd_avx(auVar163,auVar163,3);
    auVar54 = vshufpd_avx(auVar46,auVar46,3);
    auVar61 = vshufps_avx(auVar62,auVar48,0);
    auVar46 = vsubps_avx512vl(auVar53,auVar61);
    fVar202 = auVar61._0_4_;
    auVar155._0_4_ = fVar202 * auVar63._0_4_;
    fVar213 = auVar61._4_4_;
    auVar155._4_4_ = fVar213 * auVar63._4_4_;
    fVar214 = auVar61._8_4_;
    auVar155._8_4_ = fVar214 * auVar63._8_4_;
    fVar215 = auVar61._12_4_;
    auVar155._12_4_ = fVar215 * auVar63._12_4_;
    auVar164._0_4_ = fVar202 * auVar58._0_4_;
    auVar164._4_4_ = fVar213 * auVar58._4_4_;
    auVar164._8_4_ = fVar214 * auVar58._8_4_;
    auVar164._12_4_ = fVar215 * auVar58._12_4_;
    auVar240._0_4_ = auVar54._0_4_ * fVar202;
    auVar240._4_4_ = auVar54._4_4_ * fVar213;
    auVar240._8_4_ = auVar54._8_4_ * fVar214;
    auVar240._12_4_ = auVar54._12_4_ * fVar215;
    auVar141._0_4_ = fVar202 * auVar47._0_4_;
    auVar141._4_4_ = fVar213 * auVar47._4_4_;
    auVar141._8_4_ = fVar214 * auVar47._8_4_;
    auVar141._12_4_ = fVar215 * auVar47._12_4_;
    auVar63 = vfmadd231ps_fma(auVar155,auVar46,auVar124);
    auVar47 = vfmadd231ps_fma(auVar164,auVar46,auVar206);
    auVar44 = vfmadd231ps_fma(auVar240,auVar46,auVar221);
    auVar46 = vfmadd231ps_fma(auVar141,auVar46,ZEXT816(0));
    auVar54 = vsubss_avx512f(auVar45,auVar62);
    auVar58 = vmovshdup_avx(auVar39);
    auVar51 = vfmadd231ss_fma(ZEXT416((uint)(auVar58._0_4_ * auVar62._0_4_)),auVar39,auVar54);
    auVar54 = vsubss_avx512f(auVar45,auVar48);
    auVar52 = vfmadd231ss_fma(ZEXT416((uint)(auVar58._0_4_ * auVar48._0_4_)),auVar39,auVar54);
    auVar48 = vdivss_avx512f(auVar45,ZEXT416((uint)fVar218));
    auVar58 = vsubps_avx(auVar47,auVar63);
    auVar49 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar61 = vmulps_avx512vl(auVar58,auVar49);
    auVar58 = vsubps_avx(auVar44,auVar47);
    auVar62 = vmulps_avx512vl(auVar58,auVar49);
    auVar58 = vsubps_avx(auVar46,auVar44);
    auVar58 = vmulps_avx512vl(auVar58,auVar49);
    auVar54 = vminps_avx(auVar62,auVar58);
    auVar58 = vmaxps_avx(auVar62,auVar58);
    auVar54 = vminps_avx(auVar61,auVar54);
    auVar58 = vmaxps_avx(auVar61,auVar58);
    auVar61 = vshufpd_avx(auVar54,auVar54,3);
    auVar62 = vshufpd_avx(auVar58,auVar58,3);
    auVar54 = vminps_avx(auVar54,auVar61);
    auVar58 = vmaxps_avx(auVar58,auVar62);
    fVar218 = auVar48._0_4_;
    auVar185._0_4_ = auVar54._0_4_ * fVar218;
    auVar185._4_4_ = auVar54._4_4_ * fVar218;
    auVar185._8_4_ = auVar54._8_4_ * fVar218;
    auVar185._12_4_ = auVar54._12_4_ * fVar218;
    auVar173._0_4_ = fVar218 * auVar58._0_4_;
    auVar173._4_4_ = fVar218 * auVar58._4_4_;
    auVar173._8_4_ = fVar218 * auVar58._8_4_;
    auVar173._12_4_ = fVar218 * auVar58._12_4_;
    auVar48 = vdivss_avx512f(auVar45,ZEXT416((uint)(auVar52._0_4_ - auVar51._0_4_)));
    auVar58 = vshufpd_avx(auVar63,auVar63,3);
    auVar54 = vshufpd_avx(auVar47,auVar47,3);
    auVar61 = vshufpd_avx(auVar44,auVar44,3);
    auVar62 = vshufpd_avx(auVar46,auVar46,3);
    auVar58 = vsubps_avx(auVar58,auVar63);
    auVar63 = vsubps_avx(auVar54,auVar47);
    auVar47 = vsubps_avx(auVar61,auVar44);
    auVar62 = vsubps_avx(auVar62,auVar46);
    auVar54 = vminps_avx(auVar58,auVar63);
    auVar58 = vmaxps_avx(auVar58,auVar63);
    auVar61 = vminps_avx(auVar47,auVar62);
    auVar61 = vminps_avx(auVar54,auVar61);
    auVar54 = vmaxps_avx(auVar47,auVar62);
    auVar58 = vmaxps_avx(auVar58,auVar54);
    fVar218 = auVar48._0_4_;
    auVar222._0_4_ = fVar218 * auVar61._0_4_;
    auVar222._4_4_ = fVar218 * auVar61._4_4_;
    auVar222._8_4_ = fVar218 * auVar61._8_4_;
    auVar222._12_4_ = fVar218 * auVar61._12_4_;
    auVar207._0_4_ = fVar218 * auVar58._0_4_;
    auVar207._4_4_ = fVar218 * auVar58._4_4_;
    auVar207._8_4_ = fVar218 * auVar58._8_4_;
    auVar207._12_4_ = fVar218 * auVar58._12_4_;
    auVar62 = vinsertps_avx(auVar55,auVar51,0x10);
    auVar59 = vpermt2ps_avx512vl(auVar55,_DAT_01fb9f90,auVar52);
    auVar114._0_4_ = auVar62._0_4_ + auVar59._0_4_;
    auVar114._4_4_ = auVar62._4_4_ + auVar59._4_4_;
    auVar114._8_4_ = auVar62._8_4_ + auVar59._8_4_;
    auVar114._12_4_ = auVar62._12_4_ + auVar59._12_4_;
    auVar48 = vmulps_avx512vl(auVar114,auVar248._0_16_);
    auVar54 = vshufps_avx(auVar48,auVar48,0x54);
    uVar98 = auVar48._0_4_;
    auVar118._4_4_ = uVar98;
    auVar118._0_4_ = uVar98;
    auVar118._8_4_ = uVar98;
    auVar118._12_4_ = uVar98;
    auVar61 = vfmadd213ps_fma(local_c8,auVar118,local_308);
    auVar63 = vfmadd213ps_fma(local_d8,auVar118,local_318);
    auVar47 = vfmadd213ps_fma(local_e8,auVar118,local_268);
    auVar58 = vsubps_avx(auVar63,auVar61);
    auVar61 = vfmadd213ps_fma(auVar58,auVar118,auVar61);
    auVar58 = vsubps_avx(auVar47,auVar63);
    auVar58 = vfmadd213ps_fma(auVar58,auVar118,auVar63);
    auVar58 = vsubps_avx(auVar58,auVar61);
    auVar61 = vfmadd231ps_fma(auVar61,auVar58,auVar118);
    auVar44 = vmulps_avx512vl(auVar58,auVar49);
    auVar229._8_8_ = auVar61._0_8_;
    auVar229._0_8_ = auVar61._0_8_;
    auVar58 = vshufpd_avx(auVar61,auVar61,3);
    auVar61 = vshufps_avx(auVar48,auVar48,0x55);
    auVar63 = vsubps_avx(auVar58,auVar229);
    auVar47 = vfmadd231ps_fma(auVar229,auVar61,auVar63);
    auVar241._8_8_ = auVar44._0_8_;
    auVar241._0_8_ = auVar44._0_8_;
    auVar58 = vshufpd_avx(auVar44,auVar44,3);
    auVar58 = vsubps_avx512vl(auVar58,auVar241);
    auVar58 = vfmadd213ps_avx512vl(auVar58,auVar61,auVar241);
    auVar119._0_8_ = auVar63._0_8_ ^ 0x8000000080000000;
    auVar119._8_4_ = auVar63._8_4_ ^ 0x80000000;
    auVar119._12_4_ = auVar63._12_4_ ^ 0x80000000;
    auVar61 = vmovshdup_avx512vl(auVar58);
    auVar242._0_8_ = auVar61._0_8_ ^ 0x8000000080000000;
    auVar242._8_4_ = auVar61._8_4_ ^ 0x80000000;
    auVar242._12_4_ = auVar61._12_4_ ^ 0x80000000;
    auVar44 = vmovshdup_avx512vl(auVar63);
    auVar46 = vpermt2ps_avx512vl(auVar242,ZEXT416(5),auVar63);
    auVar61 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar61._0_4_ * auVar63._0_4_)),auVar58,auVar44);
    auVar63 = vpermt2ps_avx512vl(auVar58,SUB6416(ZEXT464(4),0),auVar119);
    auVar142._0_4_ = auVar61._0_4_;
    auVar142._4_4_ = auVar142._0_4_;
    auVar142._8_4_ = auVar142._0_4_;
    auVar142._12_4_ = auVar142._0_4_;
    auVar58 = vdivps_avx(auVar46,auVar142);
    auVar60 = vdivps_avx512vl(auVar63,auVar142);
    fVar218 = auVar47._0_4_;
    auVar61 = vshufps_avx(auVar47,auVar47,0x55);
    auVar230._0_4_ = fVar218 * auVar58._0_4_ + auVar61._0_4_ * auVar60._0_4_;
    auVar230._4_4_ = fVar218 * auVar58._4_4_ + auVar61._4_4_ * auVar60._4_4_;
    auVar230._8_4_ = fVar218 * auVar58._8_4_ + auVar61._8_4_ * auVar60._8_4_;
    auVar230._12_4_ = fVar218 * auVar58._12_4_ + auVar61._12_4_ * auVar60._12_4_;
    auVar49 = vsubps_avx(auVar54,auVar230);
    auVar61 = vmovshdup_avx(auVar58);
    auVar54 = vinsertps_avx(auVar185,auVar222,0x1c);
    auVar243._0_4_ = auVar61._0_4_ * auVar54._0_4_;
    auVar243._4_4_ = auVar61._4_4_ * auVar54._4_4_;
    auVar243._8_4_ = auVar61._8_4_ * auVar54._8_4_;
    auVar243._12_4_ = auVar61._12_4_ * auVar54._12_4_;
    auVar50 = vinsertps_avx512f(auVar173,auVar207,0x1c);
    auVar61 = vmulps_avx512vl(auVar61,auVar50);
    auVar46 = vminps_avx512vl(auVar243,auVar61);
    auVar47 = vmaxps_avx(auVar61,auVar243);
    auVar44 = vmovshdup_avx(auVar60);
    auVar61 = vinsertps_avx(auVar222,auVar185,0x4c);
    auVar223._0_4_ = auVar44._0_4_ * auVar61._0_4_;
    auVar223._4_4_ = auVar44._4_4_ * auVar61._4_4_;
    auVar223._8_4_ = auVar44._8_4_ * auVar61._8_4_;
    auVar223._12_4_ = auVar44._12_4_ * auVar61._12_4_;
    auVar63 = vinsertps_avx(auVar207,auVar173,0x4c);
    auVar208._0_4_ = auVar44._0_4_ * auVar63._0_4_;
    auVar208._4_4_ = auVar44._4_4_ * auVar63._4_4_;
    auVar208._8_4_ = auVar44._8_4_ * auVar63._8_4_;
    auVar208._12_4_ = auVar44._12_4_ * auVar63._12_4_;
    auVar44 = vminps_avx(auVar223,auVar208);
    auVar46 = vaddps_avx512vl(auVar46,auVar44);
    auVar44 = vmaxps_avx(auVar208,auVar223);
    auVar209._0_4_ = auVar47._0_4_ + auVar44._0_4_;
    auVar209._4_4_ = auVar47._4_4_ + auVar44._4_4_;
    auVar209._8_4_ = auVar47._8_4_ + auVar44._8_4_;
    auVar209._12_4_ = auVar47._12_4_ + auVar44._12_4_;
    auVar224._8_8_ = 0x3f80000000000000;
    auVar224._0_8_ = 0x3f80000000000000;
    auVar47 = vsubps_avx(auVar224,auVar209);
    auVar44 = vsubps_avx(auVar224,auVar46);
    auVar46 = vsubps_avx(auVar62,auVar48);
    auVar48 = vsubps_avx(auVar59,auVar48);
    fVar215 = auVar46._0_4_;
    auVar244._0_4_ = fVar215 * auVar47._0_4_;
    fVar216 = auVar46._4_4_;
    auVar244._4_4_ = fVar216 * auVar47._4_4_;
    fVar217 = auVar46._8_4_;
    auVar244._8_4_ = fVar217 * auVar47._8_4_;
    fVar159 = auVar46._12_4_;
    auVar244._12_4_ = fVar159 * auVar47._12_4_;
    auVar37 = vbroadcastss_avx512vl(auVar58);
    auVar54 = vmulps_avx512vl(auVar37,auVar54);
    auVar50 = vmulps_avx512vl(auVar37,auVar50);
    auVar37 = vminps_avx512vl(auVar54,auVar50);
    auVar50 = vmaxps_avx512vl(auVar50,auVar54);
    auVar54 = vbroadcastss_avx512vl(auVar60);
    auVar61 = vmulps_avx512vl(auVar54,auVar61);
    auVar54 = vmulps_avx512vl(auVar54,auVar63);
    auVar63 = vminps_avx512vl(auVar61,auVar54);
    auVar63 = vaddps_avx512vl(auVar37,auVar63);
    auVar46 = vmulps_avx512vl(auVar46,auVar44);
    fVar218 = auVar48._0_4_;
    auVar210._0_4_ = fVar218 * auVar47._0_4_;
    fVar202 = auVar48._4_4_;
    auVar210._4_4_ = fVar202 * auVar47._4_4_;
    fVar213 = auVar48._8_4_;
    auVar210._8_4_ = fVar213 * auVar47._8_4_;
    fVar214 = auVar48._12_4_;
    auVar210._12_4_ = fVar214 * auVar47._12_4_;
    auVar225._0_4_ = fVar218 * auVar44._0_4_;
    auVar225._4_4_ = fVar202 * auVar44._4_4_;
    auVar225._8_4_ = fVar213 * auVar44._8_4_;
    auVar225._12_4_ = fVar214 * auVar44._12_4_;
    auVar54 = vmaxps_avx(auVar54,auVar61);
    auVar174._0_4_ = auVar50._0_4_ + auVar54._0_4_;
    auVar174._4_4_ = auVar50._4_4_ + auVar54._4_4_;
    auVar174._8_4_ = auVar50._8_4_ + auVar54._8_4_;
    auVar174._12_4_ = auVar50._12_4_ + auVar54._12_4_;
    auVar186._8_8_ = 0x3f800000;
    auVar186._0_8_ = 0x3f800000;
    auVar54 = vsubps_avx(auVar186,auVar174);
    auVar61 = vsubps_avx512vl(auVar186,auVar63);
    auVar236._0_4_ = fVar215 * auVar54._0_4_;
    auVar236._4_4_ = fVar216 * auVar54._4_4_;
    auVar236._8_4_ = fVar217 * auVar54._8_4_;
    auVar236._12_4_ = fVar159 * auVar54._12_4_;
    auVar231._0_4_ = fVar215 * auVar61._0_4_;
    auVar231._4_4_ = fVar216 * auVar61._4_4_;
    auVar231._8_4_ = fVar217 * auVar61._8_4_;
    auVar231._12_4_ = fVar159 * auVar61._12_4_;
    auVar175._0_4_ = fVar218 * auVar54._0_4_;
    auVar175._4_4_ = fVar202 * auVar54._4_4_;
    auVar175._8_4_ = fVar213 * auVar54._8_4_;
    auVar175._12_4_ = fVar214 * auVar54._12_4_;
    auVar187._0_4_ = fVar218 * auVar61._0_4_;
    auVar187._4_4_ = fVar202 * auVar61._4_4_;
    auVar187._8_4_ = fVar213 * auVar61._8_4_;
    auVar187._12_4_ = fVar214 * auVar61._12_4_;
    auVar54 = vminps_avx(auVar236,auVar231);
    auVar61 = vminps_avx512vl(auVar175,auVar187);
    auVar63 = vminps_avx512vl(auVar54,auVar61);
    auVar54 = vmaxps_avx(auVar231,auVar236);
    auVar61 = vmaxps_avx(auVar187,auVar175);
    auVar61 = vmaxps_avx(auVar61,auVar54);
    auVar47 = vminps_avx512vl(auVar244,auVar46);
    auVar54 = vminps_avx(auVar210,auVar225);
    auVar54 = vminps_avx(auVar47,auVar54);
    auVar54 = vhaddps_avx(auVar63,auVar54);
    auVar83._0_16_ = vmaxps_avx512vl(auVar46,auVar244);
    auVar63 = vmaxps_avx(auVar225,auVar210);
    auVar63 = vmaxps_avx(auVar63,auVar83._0_16_);
    auVar61 = vhaddps_avx(auVar61,auVar63);
    auVar54 = vshufps_avx(auVar54,auVar54,0xe8);
    auVar61 = vshufps_avx(auVar61,auVar61,0xe8);
    auVar176._0_4_ = auVar54._0_4_ + auVar49._0_4_;
    auVar176._4_4_ = auVar54._4_4_ + auVar49._4_4_;
    auVar176._8_4_ = auVar54._8_4_ + auVar49._8_4_;
    auVar176._12_4_ = auVar54._12_4_ + auVar49._12_4_;
    auVar188._0_4_ = auVar61._0_4_ + auVar49._0_4_;
    auVar188._4_4_ = auVar61._4_4_ + auVar49._4_4_;
    auVar188._8_4_ = auVar61._8_4_ + auVar49._8_4_;
    auVar188._12_4_ = auVar61._12_4_ + auVar49._12_4_;
    auVar54 = vmaxps_avx(auVar62,auVar176);
    auVar61 = vminps_avx(auVar188,auVar59);
    uVar2 = vcmpps_avx512vl(auVar61,auVar54,1);
  } while ((uVar2 & 3) != 0);
  uVar2 = vcmpps_avx512vl(auVar188,auVar59,1);
  uVar14 = vcmpps_avx512vl(auVar55,auVar176,1);
  if (((ushort)uVar14 & (ushort)uVar2 & 1) == 0) {
    bVar23 = 0;
  }
  else {
    auVar54 = vmovshdup_avx(auVar176);
    bVar23 = auVar51._0_4_ < auVar54._0_4_ & (byte)(uVar2 >> 1) & 0x7f;
  }
  if (((3 < (uint)uVar25 || uVar7 != 0 && !bVar35) | bVar23) != 1) goto LAB_018f2551;
  lVar27 = 0xc9;
  do {
    lVar27 = lVar27 + -1;
    if (lVar27 == 0) goto LAB_018f16f8;
    auVar55 = vsubss_avx512f(auVar45,auVar49);
    fVar213 = auVar55._0_4_;
    fVar218 = fVar213 * fVar213 * fVar213;
    auVar55 = vmulss_avx512f(auVar49,ZEXT416(0x40400000));
    fVar202 = auVar55._0_4_ * fVar213 * fVar213;
    fVar214 = auVar49._0_4_;
    auVar55 = vmulss_avx512f(ZEXT416((uint)(fVar214 * fVar214)),ZEXT416(0x40400000));
    fVar213 = fVar213 * auVar55._0_4_;
    auVar131._4_4_ = fVar218;
    auVar131._0_4_ = fVar218;
    auVar131._8_4_ = fVar218;
    auVar131._12_4_ = fVar218;
    auVar125._4_4_ = fVar202;
    auVar125._0_4_ = fVar202;
    auVar125._8_4_ = fVar202;
    auVar125._12_4_ = fVar202;
    auVar108._4_4_ = fVar213;
    auVar108._0_4_ = fVar213;
    auVar108._8_4_ = fVar213;
    auVar108._12_4_ = fVar213;
    fVar214 = fVar214 * fVar214 * fVar214;
    auVar156._0_4_ = (float)local_f8._0_4_ * fVar214;
    auVar156._4_4_ = (float)local_f8._4_4_ * fVar214;
    auVar156._8_4_ = fStack_f0 * fVar214;
    auVar156._12_4_ = fStack_ec * fVar214;
    auVar55 = vfmadd231ps_fma(auVar156,local_268,auVar108);
    auVar55 = vfmadd231ps_fma(auVar55,local_318,auVar125);
    auVar55 = vfmadd231ps_fma(auVar55,local_308,auVar131);
    auVar109._8_8_ = auVar55._0_8_;
    auVar109._0_8_ = auVar55._0_8_;
    auVar55 = vshufpd_avx(auVar55,auVar55,3);
    auVar54 = vshufps_avx(auVar49,auVar49,0x55);
    auVar55 = vsubps_avx(auVar55,auVar109);
    auVar54 = vfmadd213ps_fma(auVar55,auVar54,auVar109);
    fVar218 = auVar54._0_4_;
    auVar55 = vshufps_avx(auVar54,auVar54,0x55);
    auVar110._0_4_ = auVar58._0_4_ * fVar218 + auVar60._0_4_ * auVar55._0_4_;
    auVar110._4_4_ = auVar58._4_4_ * fVar218 + auVar60._4_4_ * auVar55._4_4_;
    auVar110._8_4_ = auVar58._8_4_ * fVar218 + auVar60._8_4_ * auVar55._8_4_;
    auVar110._12_4_ = auVar58._12_4_ * fVar218 + auVar60._12_4_ * auVar55._12_4_;
    auVar49 = vsubps_avx(auVar49,auVar110);
    auVar55 = vandps_avx512vl(auVar54,auVar249._0_16_);
    auVar83._0_16_ = vprolq_avx512vl(auVar55,0x20);
    auVar55 = vmaxss_avx(auVar83._0_16_,auVar55);
    bVar35 = (float)local_108._0_4_ < auVar55._0_4_;
  } while ((float)local_108._0_4_ <= auVar55._0_4_);
  auVar55 = vucomiss_avx512f(auVar57);
  if (bVar35) goto LAB_018f16f8;
  auVar58 = vucomiss_avx512f(auVar55);
  auVar251 = ZEXT1664(auVar58);
  if (bVar35) goto LAB_018f16f8;
  vmovshdup_avx(auVar55);
  auVar58 = vucomiss_avx512f(auVar57);
  if (bVar35) goto LAB_018f16f8;
  auVar54 = vucomiss_avx512f(auVar58);
  auVar251 = ZEXT1664(auVar54);
  if (bVar35) goto LAB_018f16f8;
  auVar61 = vinsertps_avx(ZEXT416((uint)(pre->ray_space).vx.field_0.m128[2]),
                          ZEXT416((uint)(pre->ray_space).vy.field_0.m128[2]),0x1c);
  auVar48 = vinsertps_avx(auVar61,ZEXT416((uint)(pre->ray_space).vz.field_0.m128[2]),0x28);
  aVar3 = (ray->super_RayK<1>).org.field_0;
  auVar61 = vsubps_avx(local_1a8,(undefined1  [16])aVar3);
  auVar61 = vdpps_avx(auVar61,auVar48,0x7f);
  auVar62 = vsubps_avx(local_1b8,(undefined1  [16])aVar3);
  auVar62 = vdpps_avx(auVar62,auVar48,0x7f);
  auVar63 = vsubps_avx(local_1c8,(undefined1  [16])aVar3);
  auVar63 = vdpps_avx(auVar63,auVar48,0x7f);
  auVar47 = vsubps_avx(local_1d8,(undefined1  [16])aVar3);
  auVar47 = vdpps_avx(auVar47,auVar48,0x7f);
  auVar44 = vsubps_avx(_local_1e8,(undefined1  [16])aVar3);
  auVar44 = vdpps_avx(auVar44,auVar48,0x7f);
  auVar45 = vsubps_avx(_local_1f8,(undefined1  [16])aVar3);
  auVar45 = vdpps_avx(auVar45,auVar48,0x7f);
  auVar46 = vsubps_avx(_local_208,(undefined1  [16])aVar3);
  auVar46 = vdpps_avx(auVar46,auVar48,0x7f);
  auVar49 = vsubps_avx(_local_218,(undefined1  [16])aVar3);
  auVar48 = vdpps_avx(auVar49,auVar48,0x7f);
  auVar49 = vsubss_avx512f(auVar54,auVar58);
  fVar218 = auVar58._0_4_;
  auVar58 = vfmadd231ss_fma(ZEXT416((uint)(auVar44._0_4_ * fVar218)),auVar49,auVar61);
  auVar61 = vfmadd231ss_fma(ZEXT416((uint)(auVar45._0_4_ * fVar218)),auVar49,auVar62);
  auVar62 = vfmadd231ss_fma(ZEXT416((uint)(auVar46._0_4_ * fVar218)),auVar49,auVar63);
  auVar63 = vfmadd231ss_fma(ZEXT416((uint)(fVar218 * auVar48._0_4_)),auVar49,auVar47);
  auVar54 = vsubss_avx512f(auVar54,auVar55);
  auVar157._0_4_ = auVar54._0_4_;
  fVar202 = auVar157._0_4_ * auVar157._0_4_ * auVar157._0_4_;
  auVar54 = vmulss_avx512f(auVar55,ZEXT416(0x40400000));
  fVar213 = auVar54._0_4_ * auVar157._0_4_ * auVar157._0_4_;
  fVar218 = auVar55._0_4_;
  auVar143._0_4_ = fVar218 * fVar218;
  auVar143._4_4_ = auVar55._4_4_ * auVar55._4_4_;
  auVar143._8_4_ = auVar55._8_4_ * auVar55._8_4_;
  auVar143._12_4_ = auVar55._12_4_ * auVar55._12_4_;
  auVar83._0_16_ = vmulss_avx512f(auVar143,ZEXT416(0x40400000));
  fVar214 = auVar157._0_4_ * auVar83._0_4_;
  fVar216 = fVar218 * auVar143._0_4_;
  auVar54 = vfmadd231ss_fma(ZEXT416((uint)(fVar216 * auVar63._0_4_)),ZEXT416((uint)fVar214),auVar62)
  ;
  auVar54 = vfmadd231ss_fma(auVar54,ZEXT416((uint)fVar213),auVar61);
  auVar58 = vfmadd231ss_fma(auVar54,ZEXT416((uint)fVar202),auVar58);
  fVar215 = auVar58._0_4_;
  if ((fVar215 < (ray->super_RayK<1>).org.field_0.m128[3]) ||
     (fVar217 = (ray->super_RayK<1>).tfar, fVar217 < fVar215)) goto LAB_018f16f8;
  auVar58 = vshufps_avx(auVar55,auVar55,0x55);
  auVar61 = vsubps_avx512vl(auVar53,auVar58);
  fVar159 = auVar58._0_4_;
  auVar189._0_4_ = fVar159 * (float)local_1e8._0_4_;
  fVar168 = auVar58._4_4_;
  auVar189._4_4_ = fVar168 * (float)local_1e8._4_4_;
  fVar177 = auVar58._8_4_;
  auVar189._8_4_ = fVar177 * fStack_1e0;
  fVar191 = auVar58._12_4_;
  auVar189._12_4_ = fVar191 * fStack_1dc;
  auVar199._0_4_ = fVar159 * (float)local_1f8._0_4_;
  auVar199._4_4_ = fVar168 * (float)local_1f8._4_4_;
  auVar199._8_4_ = fVar177 * fStack_1f0;
  auVar199._12_4_ = fVar191 * fStack_1ec;
  auVar211._0_4_ = fVar159 * (float)local_208._0_4_;
  auVar211._4_4_ = fVar168 * (float)local_208._4_4_;
  auVar211._8_4_ = fVar177 * fStack_200;
  auVar211._12_4_ = fVar191 * fStack_1fc;
  auVar165._0_4_ = fVar159 * (float)local_218._0_4_;
  auVar165._4_4_ = fVar168 * (float)local_218._4_4_;
  auVar165._8_4_ = fVar177 * fStack_210;
  auVar165._12_4_ = fVar191 * fStack_20c;
  auVar53 = vfmadd231ps_fma(auVar189,auVar61,local_1a8);
  auVar58 = vfmadd231ps_fma(auVar199,auVar61,local_1b8);
  auVar54 = vfmadd231ps_fma(auVar211,auVar61,local_1c8);
  auVar61 = vfmadd231ps_fma(auVar165,auVar61,local_1d8);
  auVar53 = vsubps_avx(auVar58,auVar53);
  auVar58 = vsubps_avx(auVar54,auVar58);
  auVar54 = vsubps_avx(auVar61,auVar54);
  auVar212._0_4_ = fVar218 * auVar58._0_4_;
  auVar212._4_4_ = fVar218 * auVar58._4_4_;
  auVar212._8_4_ = fVar218 * auVar58._8_4_;
  auVar212._12_4_ = fVar218 * auVar58._12_4_;
  auVar157._4_4_ = auVar157._0_4_;
  auVar157._8_4_ = auVar157._0_4_;
  auVar157._12_4_ = auVar157._0_4_;
  auVar53 = vfmadd231ps_fma(auVar212,auVar157,auVar53);
  auVar166._0_4_ = fVar218 * auVar54._0_4_;
  auVar166._4_4_ = fVar218 * auVar54._4_4_;
  auVar166._8_4_ = fVar218 * auVar54._8_4_;
  auVar166._12_4_ = fVar218 * auVar54._12_4_;
  auVar58 = vfmadd231ps_fma(auVar166,auVar157,auVar58);
  auVar167._0_4_ = fVar218 * auVar58._0_4_;
  auVar167._4_4_ = fVar218 * auVar58._4_4_;
  auVar167._8_4_ = fVar218 * auVar58._8_4_;
  auVar167._12_4_ = fVar218 * auVar58._12_4_;
  auVar53 = vfmadd231ps_fma(auVar167,auVar157,auVar53);
  auVar19._8_4_ = 0x40400000;
  auVar19._0_8_ = 0x4040000040400000;
  auVar19._12_4_ = 0x40400000;
  auVar83._0_16_ = vmulps_avx512vl(auVar53,auVar19);
  pGVar8 = (context->scene->geometries).items[uVar6].ptr;
  if ((pGVar8->mask & (ray->super_RayK<1>).mask) == 0) goto LAB_018f16f8;
  auVar144._0_4_ = fVar216 * (float)local_148._0_4_;
  auVar144._4_4_ = fVar216 * (float)local_148._4_4_;
  auVar144._8_4_ = fVar216 * fStack_140;
  auVar144._12_4_ = fVar216 * fStack_13c;
  auVar132._4_4_ = fVar214;
  auVar132._0_4_ = fVar214;
  auVar132._8_4_ = fVar214;
  auVar132._12_4_ = fVar214;
  auVar53 = vfmadd132ps_fma(auVar132,auVar144,local_138);
  auVar126._4_4_ = fVar213;
  auVar126._0_4_ = fVar213;
  auVar126._8_4_ = fVar213;
  auVar126._12_4_ = fVar213;
  auVar53 = vfmadd132ps_fma(auVar126,auVar53,local_128);
  auVar120._4_4_ = fVar202;
  auVar120._0_4_ = fVar202;
  auVar120._8_4_ = fVar202;
  auVar120._12_4_ = fVar202;
  auVar54 = vfmadd132ps_fma(auVar120,auVar53,local_118);
  auVar53 = vshufps_avx(auVar54,auVar54,0xc9);
  auVar58 = vshufps_avx(auVar83._0_16_,auVar83._0_16_,0xc9);
  auVar121._0_4_ = auVar54._0_4_ * auVar58._0_4_;
  auVar121._4_4_ = auVar54._4_4_ * auVar58._4_4_;
  auVar121._8_4_ = auVar54._8_4_ * auVar58._8_4_;
  auVar121._12_4_ = auVar54._12_4_ * auVar58._12_4_;
  auVar58 = vfmsub231ps_fma(auVar121,auVar83._0_16_,auVar53);
  auVar53 = vshufps_avx(auVar58,auVar58,0xe9);
  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
     (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
    (ray->super_RayK<1>).tfar = fVar215;
    uVar14 = vmovlps_avx(auVar53);
    *(undefined8 *)&(ray->Ng).field_0 = uVar14;
    (ray->Ng).field_0.field_0.z = auVar58._0_4_;
    uVar14 = vmovlps_avx(auVar55);
    ray->u = (float)(int)uVar14;
    ray->v = (float)(int)((ulong)uVar14 >> 0x20);
    ray->primID = (uint)local_2f0;
    ray->geomID = uVar6;
    ray->instID[0] = context->user->instID[0];
    ray->instPrimID[0] = context->user->instPrimID[0];
    goto LAB_018f16f8;
  }
  local_188 = vmovlps_avx(auVar53);
  local_180 = auVar58._0_4_;
  local_17c = vmovlps_avx(auVar55);
  local_174 = (uint)local_2f0;
  local_170 = uVar6;
  local_16c = context->user->instID[0];
  local_168 = context->user->instPrimID[0];
  (ray->super_RayK<1>).tfar = fVar215;
  local_31c = -1;
  local_248.valid = &local_31c;
  local_248.geometryUserPtr = pGVar8->userPtr;
  local_248.context = context->user;
  local_248.ray = (RTCRayN *)ray;
  local_248.hit = (RTCHitN *)&local_188;
  local_248.N = 1;
  if (pGVar8->intersectionFilterN != (RTCFilterFunctionN)0x0) {
    local_258 = lVar31;
    (*pGVar8->intersectionFilterN)(&local_248);
    auVar247 = ZEXT3264(_DAT_01fb9fe0);
    auVar55 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
    auVar246 = ZEXT1664(auVar55);
    auVar83 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar245 = ZEXT3264(auVar83);
    auVar251 = ZEXT464(0x3f800000);
    auVar55 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar248 = ZEXT1664(auVar55);
    auVar55 = vxorps_avx512vl(auVar57,auVar57);
    auVar252 = ZEXT1664(auVar55);
    auVar55 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar250 = ZEXT1664(auVar55);
    auVar83._0_16_ = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar249 = ZEXT1664(auVar83._0_16_);
    lVar31 = local_258;
    if (*local_248.valid == 0) goto LAB_018f2540;
  }
  auVar55 = auVar252._0_16_;
  p_Var13 = context->args->filter;
  if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
    (*p_Var13)(&local_248);
    auVar247 = ZEXT3264(_DAT_01fb9fe0);
    auVar53 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
    auVar246 = ZEXT1664(auVar53);
    auVar83 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar245 = ZEXT3264(auVar83);
    auVar251 = ZEXT464(0x3f800000);
    auVar53 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar248 = ZEXT1664(auVar53);
    auVar55 = vxorps_avx512vl(auVar55,auVar55);
    auVar252 = ZEXT1664(auVar55);
    auVar55 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar250 = ZEXT1664(auVar55);
    auVar83._0_16_ = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar249 = ZEXT1664(auVar83._0_16_);
    if (*local_248.valid == 0) {
LAB_018f2540:
      auVar251 = ZEXT464(0x3f800000);
      (ray->super_RayK<1>).tfar = fVar217;
      goto LAB_018f16f8;
    }
  }
  (((Vec3f *)((long)local_248.ray + 0x30))->field_0).components[0] = *(float *)local_248.hit;
  (((Vec3f *)((long)local_248.ray + 0x30))->field_0).field_0.y = *(float *)(local_248.hit + 4);
  (((Vec3f *)((long)local_248.ray + 0x30))->field_0).field_0.z = *(float *)(local_248.hit + 8);
  *(float *)((long)local_248.ray + 0x3c) = *(float *)(local_248.hit + 0xc);
  *(float *)((long)local_248.ray + 0x40) = *(float *)(local_248.hit + 0x10);
  *(float *)((long)local_248.ray + 0x44) = *(float *)(local_248.hit + 0x14);
  *(float *)((long)local_248.ray + 0x48) = *(float *)(local_248.hit + 0x18);
  *(float *)((long)local_248.ray + 0x4c) = *(float *)(local_248.hit + 0x1c);
  *(float *)((long)local_248.ray + 0x50) = *(float *)(local_248.hit + 0x20);
  goto LAB_018f16f8;
LAB_018f2551:
  auVar39 = vinsertps_avx(auVar51,auVar52,0x10);
  goto LAB_018f11f4;
}

Assistant:

static __forceinline void intersect_n(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray.org, primID,ray.time());
          Intersector().intersect(pre,ray,context,geom,primID,curve,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }